

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Sigmoid_x86_avx512::forward_inplace(Sigmoid_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [56];
  undefined1 auVar66 [24];
  undefined1 auVar67 [40];
  undefined1 auVar68 [48];
  long *in_RSI;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  float fVar73;
  float fVar74;
  undefined1 auVar72 [32];
  __m128 _p_2;
  __m128 _zero;
  __m128 _one;
  __m256 _p_1;
  __m256 _zero_avx;
  __m256 _one_avx;
  __m512 _p;
  __m512 _zero_avx512;
  __m512 _one_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  undefined8 local_2450;
  undefined8 uStack_2448;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  int local_22d0;
  undefined8 local_22c0;
  undefined8 local_22b8;
  undefined8 local_22b0;
  undefined4 local_22a8;
  long local_22a0;
  undefined4 local_2298;
  undefined4 local_2294;
  undefined4 local_2290;
  undefined4 local_228c;
  undefined4 local_2288;
  undefined8 local_2280;
  undefined1 (*local_2278) [64];
  int local_226c;
  int local_2268;
  int local_2264;
  int local_2260;
  int local_225c;
  int local_2258;
  int local_2254;
  long *local_2248;
  undefined1 local_2235;
  int local_2234;
  undefined8 *local_2228;
  undefined8 *local_2220;
  undefined8 *local_2210;
  undefined1 local_2200 [64];
  undefined4 local_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined1 (*local_2108) [64];
  undefined1 local_2100 [64];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [8];
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  ushort local_1f42;
  float local_1f40 [2];
  float afStack_1f38 [2];
  float afStack_1f30 [2];
  float afStack_1f28 [2];
  float afStack_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [16];
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  float local_1dc0 [2];
  float afStack_1db8 [2];
  float afStack_1db0 [2];
  float afStack_1da8 [2];
  float afStack_1da0 [2];
  float afStack_1d98 [2];
  float afStack_1d90 [2];
  float afStack_1d88 [2];
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined1 (*local_1c70) [64];
  undefined4 local_1c64;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined1 (*local_1c28) [64];
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined1 local_1b80 [8];
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined1 local_1b60 [32];
  undefined4 local_1b40;
  undefined4 uStack_1b3c;
  undefined4 uStack_1b38;
  undefined4 uStack_1b34;
  undefined4 uStack_1b30;
  undefined4 uStack_1b2c;
  undefined4 uStack_1b28;
  undefined4 uStack_1b24;
  undefined1 local_1b20 [32];
  undefined1 local_1b00 [32];
  undefined1 local_1ae0 [8];
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined1 local_1ac0 [32];
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined1 (*local_1988) [64];
  undefined4 local_1980;
  undefined4 uStack_197c;
  undefined4 uStack_1978;
  undefined4 uStack_1974;
  undefined4 local_1964;
  undefined1 local_1960 [16];
  undefined1 (*local_1948) [64];
  float local_1940;
  float fStack_193c;
  float fStack_1938;
  float fStack_1934;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 local_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined1 local_18f0 [8];
  undefined8 uStack_18e8;
  undefined1 local_18e0 [16];
  undefined4 local_18d0;
  undefined4 uStack_18cc;
  undefined4 uStack_18c8;
  undefined4 uStack_18c4;
  undefined1 local_18c0 [16];
  undefined1 local_18b0 [8];
  undefined8 uStack_18a8;
  undefined1 local_18a0 [8];
  undefined8 uStack_1898;
  undefined1 local_1890 [16];
  undefined1 local_1880 [16];
  undefined8 local_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined4 local_1850;
  undefined4 uStack_184c;
  undefined4 uStack_1848;
  undefined4 uStack_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 local_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined1 (*local_17d8) [64];
  long local_17d0;
  undefined4 local_17c4;
  long local_17c0;
  undefined1 (*local_17b8) [64];
  undefined4 local_17ac;
  int local_17a8;
  int local_17a4;
  undefined8 *local_17a0;
  undefined4 local_1794;
  long local_1790;
  undefined8 *local_1770;
  float local_1740 [2];
  float afStack_1738 [2];
  float afStack_1730 [2];
  float afStack_1728 [2];
  float afStack_1720 [2];
  float afStack_1718 [2];
  float afStack_1710 [2];
  float afStack_1708 [2];
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  float local_16c0 [2];
  float afStack_16b8 [2];
  float afStack_16b0 [2];
  float afStack_16a8 [2];
  float afStack_16a0 [2];
  float afStack_1698 [2];
  float afStack_1690 [2];
  float afStack_1688 [2];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  float local_1580 [2];
  float afStack_1578 [2];
  float afStack_1570 [2];
  float afStack_1568 [2];
  float afStack_1560 [2];
  float afStack_1558 [2];
  float afStack_1550 [2];
  float afStack_1548 [2];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0 [2];
  float afStack_14b8 [2];
  float afStack_14b0 [2];
  float afStack_14a8 [2];
  float afStack_14a0 [2];
  float afStack_1498 [2];
  float afStack_1490 [2];
  float afStack_1488 [2];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  float local_1400 [2];
  float afStack_13f8 [2];
  float afStack_13f0 [2];
  float afStack_13e8 [2];
  float afStack_13e0 [2];
  float afStack_13d8 [2];
  float afStack_13d0 [2];
  float afStack_13c8 [2];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340 [2];
  float afStack_1338 [2];
  float afStack_1330 [2];
  float afStack_1328 [2];
  float afStack_1320 [2];
  float afStack_1318 [2];
  float afStack_1310 [2];
  float afStack_1308 [2];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  float local_1280 [2];
  float afStack_1278 [2];
  float afStack_1270 [2];
  float afStack_1268 [2];
  float afStack_1260 [2];
  float afStack_1258 [2];
  float afStack_1250 [2];
  float afStack_1248 [2];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_1200 [2];
  float afStack_11f8 [2];
  float afStack_11f0 [2];
  float afStack_11e8 [2];
  float afStack_11e0 [2];
  float afStack_11d8 [2];
  float afStack_11d0 [2];
  float afStack_11c8 [2];
  float local_11c0 [2];
  float afStack_11b8 [2];
  float afStack_11b0 [2];
  float afStack_11a8 [2];
  float afStack_11a0 [2];
  float afStack_1198 [2];
  float afStack_1190 [2];
  float afStack_1188 [2];
  float local_1180 [2];
  float afStack_1178 [2];
  float afStack_1170 [2];
  float afStack_1168 [2];
  float afStack_1160 [2];
  float afStack_1158 [2];
  float afStack_1150 [2];
  float afStack_1148 [2];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100 [2];
  float afStack_10f8 [2];
  float afStack_10f0 [2];
  float afStack_10e8 [2];
  float afStack_10e0 [2];
  float afStack_10d8 [2];
  float afStack_10d0 [2];
  float afStack_10c8 [2];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  ushort local_1042;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000 [2];
  float afStack_ff8 [2];
  float afStack_ff0 [2];
  float afStack_fe8 [2];
  float afStack_fe0 [2];
  float afStack_fd8 [2];
  float afStack_fd0 [2];
  float afStack_fc8 [2];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  float local_f40 [2];
  float afStack_f38 [2];
  float afStack_f30 [2];
  float afStack_f28 [2];
  float afStack_f20 [2];
  float afStack_f18 [2];
  float afStack_f10 [2];
  float afStack_f08 [2];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80 [2];
  float afStack_e78 [2];
  float afStack_e70 [2];
  float afStack_e68 [2];
  float afStack_e60 [2];
  float afStack_e58 [2];
  float afStack_e50 [2];
  float afStack_e48 [2];
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [64];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined4 local_c04;
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined4 local_b00;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined4 local_ae0;
  undefined4 uStack_adc;
  undefined4 uStack_ad8;
  undefined4 uStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined4 local_aa0;
  undefined4 uStack_a9c;
  undefined4 uStack_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 uStack_a88;
  undefined4 uStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined1 *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  float *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  float *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  float *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  float *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  float *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  float *local_9b8;
  float *local_9b0;
  undefined1 *local_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined1 *local_950;
  float *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  float *local_930;
  undefined1 *local_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_900 [32];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined4 local_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0 [2];
  float afStack_7d8 [2];
  float afStack_7d0 [2];
  float afStack_7c8 [2];
  float local_7c0 [2];
  float afStack_7b8 [2];
  float afStack_7b0 [2];
  float afStack_7a8 [2];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float local_780 [2];
  float afStack_778 [2];
  float afStack_770 [2];
  float afStack_768 [2];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720 [2];
  float afStack_718 [2];
  float afStack_710 [2];
  float afStack_708 [2];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0 [2];
  float afStack_6b8 [2];
  float afStack_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660 [2];
  float afStack_658 [2];
  float afStack_650 [2];
  float afStack_648 [2];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600 [2];
  float afStack_5f8 [2];
  float afStack_5f0 [2];
  float afStack_5e8 [2];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520 [2];
  float afStack_518 [2];
  float afStack_510 [2];
  float afStack_508 [2];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  float local_4c0 [2];
  float afStack_4b8 [2];
  float afStack_4b0 [2];
  float afStack_4a8 [2];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined4 local_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [16];
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2e0;
  float *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  float *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  float *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  float *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  float *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  float *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190 [2];
  float afStack_188 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0 [2];
  float afStack_a8 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2254 = *(int *)((long)in_RSI + 0x2c);
  local_2258 = (int)in_RSI[6];
  local_225c = *(int *)((long)in_RSI + 0x34);
  local_2260 = (int)in_RSI[7];
  local_2264 = (int)in_RSI[3];
  local_2268 = local_2254 * local_2258 * local_225c * local_2264;
  local_2248 = in_RSI;
  for (local_226c = 0; local_226c < local_2260; local_226c = local_226c + 1) {
    local_2228 = &local_22c0;
    local_17a4 = *(int *)((long)local_2248 + 0x2c);
    local_17a8 = (int)local_2248[6];
    local_17ac = *(undefined4 *)((long)local_2248 + 0x34);
    local_17b8 = (undefined1 (*) [64])
                 (*local_2248 + local_2248[8] * (long)local_226c * local_2248[2]);
    local_17c0 = local_2248[2];
    local_17c4 = (undefined4)local_2248[3];
    local_17d0 = local_2248[4];
    local_17a0 = &local_22c0;
    local_1790 = (long)local_17a4 * (long)local_17a8 * local_17c0;
    local_2220 = &local_22c0;
    local_2210 = &local_22c0;
    local_1794 = 0x10;
    local_2234 = local_226c;
    local_2235 = 1;
    local_22c0 = 0;
    local_22b0 = 0;
    local_22a8 = 0;
    local_2298 = 0;
    local_2294 = 0;
    local_2290 = 0;
    local_228c = 0;
    local_2288 = 0;
    local_2280 = 0;
    local_22b8 = 0;
    local_22d0 = 0;
    local_2184 = 0x3f800000;
    local_2200 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    local_2180 = 0;
    uStack_2178 = 0;
    uStack_2170 = 0;
    uStack_2168 = 0;
    uStack_2160 = 0;
    uStack_2158 = 0;
    uStack_2150 = 0;
    uStack_2148 = 0;
    local_2278 = local_17b8;
    for (; local_22d0 + 0xf < local_2268; local_22d0 = local_22d0 + 0x10) {
      local_2108 = local_2278;
      auVar65 = *(undefined1 (*) [56])*local_2278;
      uStack_1d08 = *(undefined8 *)(*local_2278 + 0x38);
      local_20c0 = local_2200._0_8_;
      uStack_20b8 = local_2200._8_8_;
      uStack_20b0 = local_2200._16_8_;
      uStack_20a8 = local_2200._24_8_;
      uStack_20a0 = local_2200._32_8_;
      uStack_2098 = local_2200._40_8_;
      uStack_2090 = local_2200._48_8_;
      uStack_2088 = local_2200._56_8_;
      local_1d00 = 0;
      uStack_1cf8 = 0;
      uStack_1cf0 = 0;
      uStack_1ce8 = 0;
      uStack_1ce0 = 0;
      uStack_1cd8 = 0;
      uStack_1cd0 = 0;
      uStack_1cc8 = 0;
      local_23c0 = auVar65._0_8_;
      local_1d40 = local_23c0;
      uStack_23b8 = auVar65._8_8_;
      uStack_1d38 = uStack_23b8;
      uStack_23b0 = auVar65._16_8_;
      uStack_1d30 = uStack_23b0;
      uStack_23a8 = auVar65._24_8_;
      uStack_1d28 = uStack_23a8;
      uStack_23a0 = auVar65._32_8_;
      uStack_1d20 = uStack_23a0;
      uStack_2398 = auVar65._40_8_;
      uStack_1d18 = uStack_2398;
      uStack_2390 = auVar65._48_8_;
      uStack_1d10 = uStack_2390;
      auVar69 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),*local_2278);
      local_1e00 = 0;
      uStack_1df8 = 0;
      uStack_1df0 = 0;
      uStack_1de8 = 0;
      uStack_1de0 = 0;
      uStack_1dd8 = 0;
      uStack_1dd0 = 0;
      uStack_1dc8 = 0;
      local_1f40[0] = 1.0;
      local_1f40[1] = 1.0;
      afStack_1f38[0] = 1.0;
      afStack_1f38[1] = 1.0;
      afStack_1f30[0] = 1.0;
      afStack_1f30[1] = 1.0;
      afStack_1f28[0] = 1.0;
      afStack_1f28[1] = 1.0;
      afStack_1f20[0] = 1.0;
      afStack_1f20[1] = 1.0;
      afStack_1f18[0] = 1.0;
      afStack_1f18[1] = 1.0;
      afStack_1f10[0] = 1.0;
      afStack_1f10[1] = 1.0;
      afStack_1f08[0] = 1.0;
      afStack_1f08[1] = 1.0;
      local_1e40._0_8_ = auVar69._0_8_;
      local_1700 = local_1e40._0_8_;
      local_1e40._8_8_ = auVar69._8_8_;
      uStack_16f8 = local_1e40._8_8_;
      local_1e40._16_8_ = auVar69._16_8_;
      uStack_16f0 = local_1e40._16_8_;
      local_1e40._24_8_ = auVar69._24_8_;
      uStack_16e8 = local_1e40._24_8_;
      local_1e40._32_8_ = auVar69._32_8_;
      uStack_16e0 = local_1e40._32_8_;
      local_1e40._40_8_ = auVar69._40_8_;
      uStack_16d8 = local_1e40._40_8_;
      local_1e40._48_8_ = auVar69._48_8_;
      uStack_16d0 = local_1e40._48_8_;
      local_1e40._56_8_ = auVar69._56_8_;
      uStack_16c8 = local_1e40._56_8_;
      local_1740[0] = 88.37626;
      local_1740[1] = 88.37626;
      afStack_1738[0] = 88.37626;
      afStack_1738[1] = 88.37626;
      afStack_1730[0] = 88.37626;
      afStack_1730[1] = 88.37626;
      afStack_1728[0] = 88.37626;
      afStack_1728[1] = 88.37626;
      afStack_1720[0] = 88.37626;
      afStack_1720[1] = 88.37626;
      afStack_1718[0] = 88.37626;
      afStack_1718[1] = 88.37626;
      afStack_1710[0] = 88.37626;
      afStack_1710[1] = 88.37626;
      afStack_1708[0] = 88.37626;
      afStack_1708[1] = 88.37626;
      auVar70._8_4_ = 88.37626;
      auVar70._12_4_ = 88.37626;
      auVar70._0_4_ = 88.37626;
      auVar70._4_4_ = 88.37626;
      auVar70._16_4_ = 88.37626;
      auVar70._20_4_ = 88.37626;
      auVar70._24_4_ = 88.37626;
      auVar70._28_4_ = 88.37626;
      auVar70._32_4_ = 88.37626;
      auVar70._36_4_ = 88.37626;
      auVar70._40_4_ = 88.37626;
      auVar70._44_4_ = 88.37626;
      auVar70._48_4_ = 88.37626;
      auVar70._52_4_ = 88.37626;
      auVar70._56_4_ = 88.37626;
      auVar70._60_4_ = 88.37626;
      auVar69 = vminps_avx512f(auVar69,auVar70);
      local_1e40._0_8_ = auVar69._0_8_;
      local_1680 = local_1e40._0_8_;
      local_1e40._8_8_ = auVar69._8_8_;
      uStack_1678 = local_1e40._8_8_;
      local_1e40._16_8_ = auVar69._16_8_;
      uStack_1670 = local_1e40._16_8_;
      local_1e40._24_8_ = auVar69._24_8_;
      uStack_1668 = local_1e40._24_8_;
      local_1e40._32_8_ = auVar69._32_8_;
      uStack_1660 = local_1e40._32_8_;
      local_1e40._40_8_ = auVar69._40_8_;
      uStack_1658 = local_1e40._40_8_;
      local_1e40._48_8_ = auVar69._48_8_;
      uStack_1650 = local_1e40._48_8_;
      local_1e40._56_8_ = auVar69._56_8_;
      uStack_1648 = local_1e40._56_8_;
      local_16c0[0] = -88.37626;
      local_16c0[1] = -88.37626;
      afStack_16b8[0] = -88.37626;
      afStack_16b8[1] = -88.37626;
      afStack_16b0[0] = -88.37626;
      afStack_16b0[1] = -88.37626;
      afStack_16a8[0] = -88.37626;
      afStack_16a8[1] = -88.37626;
      afStack_16a0[0] = -88.37626;
      afStack_16a0[1] = -88.37626;
      afStack_1698[0] = -88.37626;
      afStack_1698[1] = -88.37626;
      afStack_1690[0] = -88.37626;
      afStack_1690[1] = -88.37626;
      afStack_1688[0] = -88.37626;
      afStack_1688[1] = -88.37626;
      auVar71._8_4_ = -88.37626;
      auVar71._12_4_ = -88.37626;
      auVar71._0_4_ = -88.37626;
      auVar71._4_4_ = -88.37626;
      auVar71._16_4_ = -88.37626;
      auVar71._20_4_ = -88.37626;
      auVar71._24_4_ = -88.37626;
      auVar71._28_4_ = -88.37626;
      auVar71._32_4_ = -88.37626;
      auVar71._36_4_ = -88.37626;
      auVar71._40_4_ = -88.37626;
      auVar71._44_4_ = -88.37626;
      auVar71._48_4_ = -88.37626;
      auVar71._52_4_ = -88.37626;
      auVar71._56_4_ = -88.37626;
      auVar71._60_4_ = -88.37626;
      auVar69 = vmaxps_avx512f(auVar69,auVar71);
      local_1e40._0_8_ = auVar69._0_8_;
      local_1140 = local_1e40._0_8_;
      local_1e40._8_8_ = auVar69._8_8_;
      uStack_1138 = local_1e40._8_8_;
      local_1e40._16_8_ = auVar69._16_8_;
      uStack_1130 = local_1e40._16_8_;
      local_1e40._24_8_ = auVar69._24_8_;
      uStack_1128 = local_1e40._24_8_;
      local_1e40._32_8_ = auVar69._32_8_;
      uStack_1120 = local_1e40._32_8_;
      local_1e40._40_8_ = auVar69._40_8_;
      uStack_1118 = local_1e40._40_8_;
      local_1e40._48_8_ = auVar69._48_8_;
      uStack_1110 = local_1e40._48_8_;
      local_1e40._56_8_ = auVar69._56_8_;
      uStack_1108 = local_1e40._56_8_;
      local_1180[0] = 1.442695;
      local_1180[1] = 1.442695;
      afStack_1178[0] = 1.442695;
      afStack_1178[1] = 1.442695;
      afStack_1170[0] = 1.442695;
      afStack_1170[1] = 1.442695;
      afStack_1168[0] = 1.442695;
      afStack_1168[1] = 1.442695;
      afStack_1160[0] = 1.442695;
      afStack_1160[1] = 1.442695;
      afStack_1158[0] = 1.442695;
      afStack_1158[1] = 1.442695;
      afStack_1150[0] = 1.442695;
      afStack_1150[1] = 1.442695;
      afStack_1148[0] = 1.442695;
      afStack_1148[1] = 1.442695;
      local_11c0[0] = 0.5;
      local_11c0[1] = 0.5;
      afStack_11b8[0] = 0.5;
      afStack_11b8[1] = 0.5;
      afStack_11b0[0] = 0.5;
      afStack_11b0[1] = 0.5;
      afStack_11a8[0] = 0.5;
      afStack_11a8[1] = 0.5;
      afStack_11a0[0] = 0.5;
      afStack_11a0[1] = 0.5;
      afStack_1198[0] = 0.5;
      afStack_1198[1] = 0.5;
      afStack_1190[0] = 0.5;
      afStack_1190[1] = 0.5;
      afStack_1188[0] = 0.5;
      afStack_1188[1] = 0.5;
      auVar33._8_4_ = 1.442695;
      auVar33._12_4_ = 1.442695;
      auVar33._0_4_ = 1.442695;
      auVar33._4_4_ = 1.442695;
      auVar33._16_4_ = 1.442695;
      auVar33._20_4_ = 1.442695;
      auVar33._24_4_ = 1.442695;
      auVar33._28_4_ = 1.442695;
      auVar33._32_4_ = 1.442695;
      auVar33._36_4_ = 1.442695;
      auVar33._40_4_ = 1.442695;
      auVar33._44_4_ = 1.442695;
      auVar33._48_4_ = 1.442695;
      auVar33._52_4_ = 1.442695;
      auVar33._56_4_ = 1.442695;
      auVar33._60_4_ = 1.442695;
      auVar32._8_4_ = 0.5;
      auVar32._12_4_ = 0.5;
      auVar32._0_4_ = 0.5;
      auVar32._4_4_ = 0.5;
      auVar32._16_4_ = 0.5;
      auVar32._20_4_ = 0.5;
      auVar32._24_4_ = 0.5;
      auVar32._28_4_ = 0.5;
      auVar32._32_4_ = 0.5;
      auVar32._36_4_ = 0.5;
      auVar32._40_4_ = 0.5;
      auVar32._44_4_ = 0.5;
      auVar32._48_4_ = 0.5;
      auVar32._52_4_ = 0.5;
      auVar32._56_4_ = 0.5;
      auVar32._60_4_ = 0.5;
      auVar70 = vfmadd213ps_avx512f(auVar33,auVar69,auVar32);
      auVar71 = vrndscaleps_avx512f(auVar70,1);
      uVar22 = vcmpps_avx512f(auVar70,auVar71,1);
      local_1f42 = (ushort)uVar22;
      local_1e80._0_8_ = auVar71._0_8_;
      local_10c0 = local_1e80._0_8_;
      local_1e80._8_8_ = auVar71._8_8_;
      uStack_10b8 = local_1e80._8_8_;
      local_1e80._16_8_ = auVar71._16_8_;
      uStack_10b0 = local_1e80._16_8_;
      local_1e80._24_8_ = auVar71._24_8_;
      uStack_10a8 = local_1e80._24_8_;
      local_1e80._32_8_ = auVar71._32_8_;
      uStack_10a0 = local_1e80._32_8_;
      local_1e80._40_8_ = auVar71._40_8_;
      uStack_1098 = local_1e80._40_8_;
      local_1e80._48_8_ = auVar71._48_8_;
      uStack_1090 = local_1e80._48_8_;
      local_1e80._56_8_ = auVar71._56_8_;
      uStack_1088 = local_1e80._56_8_;
      local_1100[0] = 1.0;
      local_1100[1] = 1.0;
      afStack_10f8[0] = 1.0;
      afStack_10f8[1] = 1.0;
      afStack_10f0[0] = 1.0;
      afStack_10f0[1] = 1.0;
      afStack_10e8[0] = 1.0;
      afStack_10e8[1] = 1.0;
      afStack_10e0[0] = 1.0;
      afStack_10e0[1] = 1.0;
      afStack_10d8[0] = 1.0;
      afStack_10d8[1] = 1.0;
      afStack_10d0[0] = 1.0;
      afStack_10d0[1] = 1.0;
      afStack_10c8[0] = 1.0;
      afStack_10c8[1] = 1.0;
      local_fc0 = local_1e80._0_8_;
      uStack_fb8 = local_1e80._8_8_;
      uStack_fb0 = local_1e80._16_8_;
      uStack_fa8 = local_1e80._24_8_;
      uStack_fa0 = local_1e80._32_8_;
      uStack_f98 = local_1e80._40_8_;
      uStack_f90 = local_1e80._48_8_;
      uStack_f88 = local_1e80._56_8_;
      local_1000[0] = 1.0;
      local_1000[1] = 1.0;
      afStack_ff8[0] = 1.0;
      afStack_ff8[1] = 1.0;
      afStack_ff0[0] = 1.0;
      afStack_ff0[1] = 1.0;
      afStack_fe8[0] = 1.0;
      afStack_fe8[1] = 1.0;
      afStack_fe0[0] = 1.0;
      afStack_fe0[1] = 1.0;
      afStack_fd8[0] = 1.0;
      afStack_fd8[1] = 1.0;
      afStack_fd0[0] = 1.0;
      afStack_fd0[1] = 1.0;
      afStack_fc8[0] = 1.0;
      afStack_fc8[1] = 1.0;
      auVar34._8_4_ = 1.0;
      auVar34._12_4_ = 1.0;
      auVar34._0_4_ = 1.0;
      auVar34._4_4_ = 1.0;
      auVar34._16_4_ = 1.0;
      auVar34._20_4_ = 1.0;
      auVar34._24_4_ = 1.0;
      auVar34._28_4_ = 1.0;
      auVar34._32_4_ = 1.0;
      auVar34._36_4_ = 1.0;
      auVar34._40_4_ = 1.0;
      auVar34._44_4_ = 1.0;
      auVar34._48_4_ = 1.0;
      auVar34._52_4_ = 1.0;
      auVar34._56_4_ = 1.0;
      auVar34._60_4_ = 1.0;
      local_1040._0_4_ = auVar71._0_4_;
      local_1040._4_4_ = auVar71._4_4_;
      uStack_1038._0_4_ = auVar71._8_4_;
      uStack_1038._4_4_ = auVar71._12_4_;
      uStack_1030._0_4_ = auVar71._16_4_;
      uStack_1030._4_4_ = auVar71._20_4_;
      uStack_1028._0_4_ = auVar71._24_4_;
      uStack_1028._4_4_ = auVar71._28_4_;
      uStack_1020._0_4_ = auVar71._32_4_;
      uStack_1020._4_4_ = auVar71._36_4_;
      uStack_1018._0_4_ = auVar71._40_4_;
      uStack_1018._4_4_ = auVar71._44_4_;
      uStack_1010._0_4_ = auVar71._48_4_;
      uStack_1010._4_4_ = auVar71._52_4_;
      uStack_1008._0_4_ = auVar71._56_4_;
      uStack_1008._4_4_ = auVar71._60_4_;
      auVar70 = vsubps_avx512f(auVar71,auVar34);
      bVar1 = (bool)((byte)uVar22 & 1);
      bVar2 = (bool)((byte)(local_1f42 >> 1) & 1);
      bVar3 = (bool)((byte)(local_1f42 >> 2) & 1);
      bVar4 = (bool)((byte)(local_1f42 >> 3) & 1);
      bVar5 = (bool)((byte)(local_1f42 >> 4) & 1);
      bVar6 = (bool)((byte)(local_1f42 >> 5) & 1);
      bVar7 = (bool)((byte)(local_1f42 >> 6) & 1);
      bVar8 = (bool)((byte)(local_1f42 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar22 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_1ec0._4_4_ = (uint)bVar2 * auVar70._4_4_ | (uint)!bVar2 * local_1040._4_4_;
      local_1ec0._0_4_ = (uint)bVar1 * auVar70._0_4_ | (uint)!bVar1 * (int)local_1040;
      local_1ec0._8_4_ = (uint)bVar3 * auVar70._8_4_ | (uint)!bVar3 * (int)uStack_1038;
      local_1ec0._12_4_ = (uint)bVar4 * auVar70._12_4_ | (uint)!bVar4 * uStack_1038._4_4_;
      uStack_1eb0._0_4_ = (uint)bVar5 * auVar70._16_4_ | (uint)!bVar5 * (int)uStack_1030;
      uStack_1eb0._4_4_ = (uint)bVar6 * auVar70._20_4_ | (uint)!bVar6 * uStack_1030._4_4_;
      auVar66 = _local_1ec0;
      uStack_1ea8._0_4_ = (uint)bVar7 * auVar70._24_4_ | (uint)!bVar7 * (int)uStack_1028;
      uStack_1ea8._4_4_ = (uint)bVar8 * auVar70._28_4_ | (uint)!bVar8 * uStack_1028._4_4_;
      auVar21 = _local_1ec0;
      uStack_1ea0._0_4_ =
           (uint)(bVar9 & 1) * auVar70._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_1020;
      uStack_1ea0._4_4_ = (uint)bVar10 * auVar70._36_4_ | (uint)!bVar10 * uStack_1020._4_4_;
      auVar67 = _local_1ec0;
      uStack_1e98._0_4_ = (uint)bVar11 * auVar70._40_4_ | (uint)!bVar11 * (int)uStack_1018;
      uStack_1e98._4_4_ = (uint)bVar12 * auVar70._44_4_ | (uint)!bVar12 * uStack_1018._4_4_;
      auVar68 = _local_1ec0;
      uStack_1e90._0_4_ = (uint)bVar13 * auVar70._48_4_ | (uint)!bVar13 * (int)uStack_1010;
      uStack_1e90._4_4_ = (uint)bVar14 * auVar70._52_4_ | (uint)!bVar14 * uStack_1010._4_4_;
      auVar65 = _local_1ec0;
      uStack_1e88._0_4_ = (uint)bVar15 * auVar70._56_4_ | (uint)!bVar15 * (int)uStack_1008;
      uStack_1e88._4_4_ =
           (uint)(bVar9 >> 7) * auVar70._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1008._4_4_;
      auVar70 = _local_1ec0;
      local_e40 = local_1ec0._0_8_;
      uStack_e38 = local_1ec0._8_8_;
      uStack_1eb0 = auVar66._16_8_;
      uStack_e30 = uStack_1eb0;
      uStack_1ea8 = auVar21._24_8_;
      uStack_e28 = uStack_1ea8;
      uStack_1ea0 = auVar67._32_8_;
      uStack_e20 = uStack_1ea0;
      uStack_1e98 = auVar68._40_8_;
      uStack_e18 = uStack_1e98;
      uStack_1e90 = auVar65._48_8_;
      uStack_e10 = uStack_1e90;
      uStack_1e88 = auVar70._56_8_;
      uStack_e08 = uStack_1e88;
      local_e80[0] = 0.6933594;
      local_e80[1] = 0.6933594;
      afStack_e78[0] = 0.6933594;
      afStack_e78[1] = 0.6933594;
      afStack_e70[0] = 0.6933594;
      afStack_e70[1] = 0.6933594;
      afStack_e68[0] = 0.6933594;
      afStack_e68[1] = 0.6933594;
      afStack_e60[0] = 0.6933594;
      afStack_e60[1] = 0.6933594;
      afStack_e58[0] = 0.6933594;
      afStack_e58[1] = 0.6933594;
      afStack_e50[0] = 0.6933594;
      afStack_e50[1] = 0.6933594;
      afStack_e48[0] = 0.6933594;
      afStack_e48[1] = 0.6933594;
      local_ec0 = local_1e40._0_8_;
      uStack_eb8 = local_1e40._8_8_;
      uStack_eb0 = local_1e40._16_8_;
      uStack_ea8 = local_1e40._24_8_;
      uStack_ea0 = local_1e40._32_8_;
      uStack_e98 = local_1e40._40_8_;
      uStack_e90 = local_1e40._48_8_;
      uStack_e88 = local_1e40._56_8_;
      auVar38._16_8_ = uStack_1eb0;
      auVar38._0_16_ = local_1ec0;
      auVar38._24_8_ = uStack_1ea8;
      auVar38._32_8_ = uStack_1ea0;
      auVar38._40_8_ = uStack_1e98;
      auVar38._48_8_ = uStack_1e90;
      auVar38._56_8_ = uStack_1e88;
      auVar37._8_4_ = 0.6933594;
      auVar37._12_4_ = 0.6933594;
      auVar37._0_4_ = 0.6933594;
      auVar37._4_4_ = 0.6933594;
      auVar37._16_4_ = 0.6933594;
      auVar37._20_4_ = 0.6933594;
      auVar37._24_4_ = 0.6933594;
      auVar37._28_4_ = 0.6933594;
      auVar37._32_4_ = 0.6933594;
      auVar37._36_4_ = 0.6933594;
      auVar37._40_4_ = 0.6933594;
      auVar37._44_4_ = 0.6933594;
      auVar37._48_4_ = 0.6933594;
      auVar37._52_4_ = 0.6933594;
      auVar37._56_4_ = 0.6933594;
      auVar37._60_4_ = 0.6933594;
      auVar69 = vfnmadd213ps_avx512f(auVar37,auVar38,auVar69);
      local_f00 = local_1ec0._0_8_;
      uStack_ef8 = local_1ec0._8_8_;
      uStack_ef0 = uStack_1eb0;
      uStack_ee8 = uStack_1ea8;
      uStack_ee0 = uStack_1ea0;
      uStack_ed8 = uStack_1e98;
      uStack_ed0 = uStack_1e90;
      uStack_ec8 = uStack_1e88;
      local_f40[0] = -0.00021219444;
      local_f40[1] = -0.00021219444;
      afStack_f38[0] = -0.00021219444;
      afStack_f38[1] = -0.00021219444;
      afStack_f30[0] = -0.00021219444;
      afStack_f30[1] = -0.00021219444;
      afStack_f28[0] = -0.00021219444;
      afStack_f28[1] = -0.00021219444;
      afStack_f20[0] = -0.00021219444;
      afStack_f20[1] = -0.00021219444;
      afStack_f18[0] = -0.00021219444;
      afStack_f18[1] = -0.00021219444;
      afStack_f10[0] = -0.00021219444;
      afStack_f10[1] = -0.00021219444;
      afStack_f08[0] = -0.00021219444;
      afStack_f08[1] = -0.00021219444;
      local_1e40._0_8_ = auVar69._0_8_;
      local_f80 = local_1e40._0_8_;
      local_1e40._8_8_ = auVar69._8_8_;
      uStack_f78 = local_1e40._8_8_;
      local_1e40._16_8_ = auVar69._16_8_;
      uStack_f70 = local_1e40._16_8_;
      local_1e40._24_8_ = auVar69._24_8_;
      uStack_f68 = local_1e40._24_8_;
      local_1e40._32_8_ = auVar69._32_8_;
      uStack_f60 = local_1e40._32_8_;
      local_1e40._40_8_ = auVar69._40_8_;
      uStack_f58 = local_1e40._40_8_;
      local_1e40._48_8_ = auVar69._48_8_;
      uStack_f50 = local_1e40._48_8_;
      local_1e40._56_8_ = auVar69._56_8_;
      uStack_f48 = local_1e40._56_8_;
      auVar36._16_8_ = uStack_1eb0;
      auVar36._0_16_ = local_1ec0;
      auVar36._24_8_ = uStack_1ea8;
      auVar36._32_8_ = uStack_1ea0;
      auVar36._40_8_ = uStack_1e98;
      auVar36._48_8_ = uStack_1e90;
      auVar36._56_8_ = uStack_1e88;
      auVar35._8_4_ = -0.00021219444;
      auVar35._12_4_ = -0.00021219444;
      auVar35._0_4_ = -0.00021219444;
      auVar35._4_4_ = -0.00021219444;
      auVar35._16_4_ = -0.00021219444;
      auVar35._20_4_ = -0.00021219444;
      auVar35._24_4_ = -0.00021219444;
      auVar35._28_4_ = -0.00021219444;
      auVar35._32_4_ = -0.00021219444;
      auVar35._36_4_ = -0.00021219444;
      auVar35._40_4_ = -0.00021219444;
      auVar35._44_4_ = -0.00021219444;
      auVar35._48_4_ = -0.00021219444;
      auVar35._52_4_ = -0.00021219444;
      auVar35._56_4_ = -0.00021219444;
      auVar35._60_4_ = -0.00021219444;
      local_1e40 = vfnmadd213ps_avx512f(auVar35,auVar36,auVar69);
      local_d80 = local_1e40._0_8_;
      uStack_d78 = local_1e40._8_8_;
      uStack_d70 = local_1e40._16_8_;
      uStack_d68 = local_1e40._24_8_;
      uStack_d60 = local_1e40._32_8_;
      uStack_d58 = local_1e40._40_8_;
      uStack_d50 = local_1e40._48_8_;
      uStack_d48 = local_1e40._56_8_;
      local_1e80 = vmulps_avx512f(local_1e40,local_1e40);
      uStack_1fb8._0_4_ = 0.00019875691;
      uStack_1fb8._4_4_ = 0.00019875691;
      local_1fc0._0_4_ = 0.00019875691;
      local_1fc0._4_4_ = 0.00019875691;
      local_1200[0] = 0.00019875691;
      local_1200[1] = 0.00019875691;
      afStack_11f8[0] = 0.00019875691;
      afStack_11f8[1] = 0.00019875691;
      afStack_11f0[0] = 0.00019875691;
      afStack_11f0[1] = 0.00019875691;
      afStack_11e8[0] = 0.00019875691;
      afStack_11e8[1] = 0.00019875691;
      afStack_11e0[0] = 0.00019875691;
      afStack_11e0[1] = 0.00019875691;
      afStack_11d8[0] = 0.00019875691;
      afStack_11d8[1] = 0.00019875691;
      afStack_11d0[0] = 0.00019875691;
      afStack_11d0[1] = 0.00019875691;
      afStack_11c8[0] = 0.00019875691;
      afStack_11c8[1] = 0.00019875691;
      local_1240 = local_1e40._0_8_;
      uStack_1238 = local_1e40._8_8_;
      uStack_1230 = local_1e40._16_8_;
      uStack_1228 = local_1e40._24_8_;
      uStack_1220 = local_1e40._32_8_;
      uStack_1218 = local_1e40._40_8_;
      uStack_1210 = local_1e40._48_8_;
      uStack_1208 = local_1e40._56_8_;
      local_1280[0] = 0.0013981999;
      local_1280[1] = 0.0013981999;
      afStack_1278[0] = 0.0013981999;
      afStack_1278[1] = 0.0013981999;
      afStack_1270[0] = 0.0013981999;
      afStack_1270[1] = 0.0013981999;
      afStack_1268[0] = 0.0013981999;
      afStack_1268[1] = 0.0013981999;
      afStack_1260[0] = 0.0013981999;
      afStack_1260[1] = 0.0013981999;
      afStack_1258[0] = 0.0013981999;
      afStack_1258[1] = 0.0013981999;
      afStack_1250[0] = 0.0013981999;
      afStack_1250[1] = 0.0013981999;
      afStack_1248[0] = 0.0013981999;
      afStack_1248[1] = 0.0013981999;
      auVar31._16_4_ = 0.00019875691;
      auVar31._20_4_ = 0.00019875691;
      auVar31._0_16_ = _local_1fc0;
      auVar31._24_4_ = 0.00019875691;
      auVar31._28_4_ = 0.00019875691;
      auVar31._32_4_ = 0.00019875691;
      auVar31._36_4_ = 0.00019875691;
      auVar31._40_4_ = 0.00019875691;
      auVar31._44_4_ = 0.00019875691;
      auVar31._48_4_ = 0.00019875691;
      auVar31._52_4_ = 0.00019875691;
      auVar31._56_4_ = 0.00019875691;
      auVar31._60_4_ = 0.00019875691;
      auVar30._8_4_ = 0.0013981999;
      auVar30._12_4_ = 0.0013981999;
      auVar30._0_4_ = 0.0013981999;
      auVar30._4_4_ = 0.0013981999;
      auVar30._16_4_ = 0.0013981999;
      auVar30._20_4_ = 0.0013981999;
      auVar30._24_4_ = 0.0013981999;
      auVar30._28_4_ = 0.0013981999;
      auVar30._32_4_ = 0.0013981999;
      auVar30._36_4_ = 0.0013981999;
      auVar30._40_4_ = 0.0013981999;
      auVar30._44_4_ = 0.0013981999;
      auVar30._48_4_ = 0.0013981999;
      auVar30._52_4_ = 0.0013981999;
      auVar30._56_4_ = 0.0013981999;
      auVar30._60_4_ = 0.0013981999;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar31,auVar30);
      local_1fc0 = auVar69._0_8_;
      local_12c0 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_12b8 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_12b0 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_12a8 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_12a0 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1298 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1290 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1288 = uStack_1f88;
      local_1300 = local_1e40._0_8_;
      uStack_12f8 = local_1e40._8_8_;
      uStack_12f0 = local_1e40._16_8_;
      uStack_12e8 = local_1e40._24_8_;
      uStack_12e0 = local_1e40._32_8_;
      uStack_12d8 = local_1e40._40_8_;
      uStack_12d0 = local_1e40._48_8_;
      uStack_12c8 = local_1e40._56_8_;
      local_1340[0] = 0.008333452;
      local_1340[1] = 0.008333452;
      afStack_1338[0] = 0.008333452;
      afStack_1338[1] = 0.008333452;
      afStack_1330[0] = 0.008333452;
      afStack_1330[1] = 0.008333452;
      afStack_1328[0] = 0.008333452;
      afStack_1328[1] = 0.008333452;
      afStack_1320[0] = 0.008333452;
      afStack_1320[1] = 0.008333452;
      afStack_1318[0] = 0.008333452;
      afStack_1318[1] = 0.008333452;
      afStack_1310[0] = 0.008333452;
      afStack_1310[1] = 0.008333452;
      afStack_1308[0] = 0.008333452;
      afStack_1308[1] = 0.008333452;
      auVar29._8_4_ = 0.008333452;
      auVar29._12_4_ = 0.008333452;
      auVar29._0_4_ = 0.008333452;
      auVar29._4_4_ = 0.008333452;
      auVar29._16_4_ = 0.008333452;
      auVar29._20_4_ = 0.008333452;
      auVar29._24_4_ = 0.008333452;
      auVar29._28_4_ = 0.008333452;
      auVar29._32_4_ = 0.008333452;
      auVar29._36_4_ = 0.008333452;
      auVar29._40_4_ = 0.008333452;
      auVar29._44_4_ = 0.008333452;
      auVar29._48_4_ = 0.008333452;
      auVar29._52_4_ = 0.008333452;
      auVar29._56_4_ = 0.008333452;
      auVar29._60_4_ = 0.008333452;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar69,auVar29);
      local_1fc0 = auVar69._0_8_;
      local_1380 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_1378 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_1370 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_1368 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_1360 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1358 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1350 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1348 = uStack_1f88;
      local_13c0 = local_1e40._0_8_;
      uStack_13b8 = local_1e40._8_8_;
      uStack_13b0 = local_1e40._16_8_;
      uStack_13a8 = local_1e40._24_8_;
      uStack_13a0 = local_1e40._32_8_;
      uStack_1398 = local_1e40._40_8_;
      uStack_1390 = local_1e40._48_8_;
      uStack_1388 = local_1e40._56_8_;
      local_1400[0] = 0.041665796;
      local_1400[1] = 0.041665796;
      afStack_13f8[0] = 0.041665796;
      afStack_13f8[1] = 0.041665796;
      afStack_13f0[0] = 0.041665796;
      afStack_13f0[1] = 0.041665796;
      afStack_13e8[0] = 0.041665796;
      afStack_13e8[1] = 0.041665796;
      afStack_13e0[0] = 0.041665796;
      afStack_13e0[1] = 0.041665796;
      afStack_13d8[0] = 0.041665796;
      afStack_13d8[1] = 0.041665796;
      afStack_13d0[0] = 0.041665796;
      afStack_13d0[1] = 0.041665796;
      afStack_13c8[0] = 0.041665796;
      afStack_13c8[1] = 0.041665796;
      auVar28._8_4_ = 0.041665796;
      auVar28._12_4_ = 0.041665796;
      auVar28._0_4_ = 0.041665796;
      auVar28._4_4_ = 0.041665796;
      auVar28._16_4_ = 0.041665796;
      auVar28._20_4_ = 0.041665796;
      auVar28._24_4_ = 0.041665796;
      auVar28._28_4_ = 0.041665796;
      auVar28._32_4_ = 0.041665796;
      auVar28._36_4_ = 0.041665796;
      auVar28._40_4_ = 0.041665796;
      auVar28._44_4_ = 0.041665796;
      auVar28._48_4_ = 0.041665796;
      auVar28._52_4_ = 0.041665796;
      auVar28._56_4_ = 0.041665796;
      auVar28._60_4_ = 0.041665796;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar69,auVar28);
      local_1fc0 = auVar69._0_8_;
      local_1440 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_1438 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_1430 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_1428 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_1420 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1418 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1410 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1408 = uStack_1f88;
      local_1480 = local_1e40._0_8_;
      uStack_1478 = local_1e40._8_8_;
      uStack_1470 = local_1e40._16_8_;
      uStack_1468 = local_1e40._24_8_;
      uStack_1460 = local_1e40._32_8_;
      uStack_1458 = local_1e40._40_8_;
      uStack_1450 = local_1e40._48_8_;
      uStack_1448 = local_1e40._56_8_;
      local_14c0[0] = 0.16666666;
      local_14c0[1] = 0.16666666;
      afStack_14b8[0] = 0.16666666;
      afStack_14b8[1] = 0.16666666;
      afStack_14b0[0] = 0.16666666;
      afStack_14b0[1] = 0.16666666;
      afStack_14a8[0] = 0.16666666;
      afStack_14a8[1] = 0.16666666;
      afStack_14a0[0] = 0.16666666;
      afStack_14a0[1] = 0.16666666;
      afStack_1498[0] = 0.16666666;
      afStack_1498[1] = 0.16666666;
      afStack_1490[0] = 0.16666666;
      afStack_1490[1] = 0.16666666;
      afStack_1488[0] = 0.16666666;
      afStack_1488[1] = 0.16666666;
      auVar27._8_4_ = 0.16666666;
      auVar27._12_4_ = 0.16666666;
      auVar27._0_4_ = 0.16666666;
      auVar27._4_4_ = 0.16666666;
      auVar27._16_4_ = 0.16666666;
      auVar27._20_4_ = 0.16666666;
      auVar27._24_4_ = 0.16666666;
      auVar27._28_4_ = 0.16666666;
      auVar27._32_4_ = 0.16666666;
      auVar27._36_4_ = 0.16666666;
      auVar27._40_4_ = 0.16666666;
      auVar27._44_4_ = 0.16666666;
      auVar27._48_4_ = 0.16666666;
      auVar27._52_4_ = 0.16666666;
      auVar27._56_4_ = 0.16666666;
      auVar27._60_4_ = 0.16666666;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar69,auVar27);
      local_1fc0 = auVar69._0_8_;
      local_1500 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_14f8 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_14f0 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_14e8 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_14e0 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_14d8 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_14d0 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_14c8 = uStack_1f88;
      local_1540 = local_1e40._0_8_;
      uStack_1538 = local_1e40._8_8_;
      uStack_1530 = local_1e40._16_8_;
      uStack_1528 = local_1e40._24_8_;
      uStack_1520 = local_1e40._32_8_;
      uStack_1518 = local_1e40._40_8_;
      uStack_1510 = local_1e40._48_8_;
      uStack_1508 = local_1e40._56_8_;
      local_1580[0] = 0.5;
      local_1580[1] = 0.5;
      afStack_1578[0] = 0.5;
      afStack_1578[1] = 0.5;
      afStack_1570[0] = 0.5;
      afStack_1570[1] = 0.5;
      afStack_1568[0] = 0.5;
      afStack_1568[1] = 0.5;
      afStack_1560[0] = 0.5;
      afStack_1560[1] = 0.5;
      afStack_1558[0] = 0.5;
      afStack_1558[1] = 0.5;
      afStack_1550[0] = 0.5;
      afStack_1550[1] = 0.5;
      afStack_1548[0] = 0.5;
      afStack_1548[1] = 0.5;
      auVar26._8_4_ = 0.5;
      auVar26._12_4_ = 0.5;
      auVar26._0_4_ = 0.5;
      auVar26._4_4_ = 0.5;
      auVar26._16_4_ = 0.5;
      auVar26._20_4_ = 0.5;
      auVar26._24_4_ = 0.5;
      auVar26._28_4_ = 0.5;
      auVar26._32_4_ = 0.5;
      auVar26._36_4_ = 0.5;
      auVar26._40_4_ = 0.5;
      auVar26._44_4_ = 0.5;
      auVar26._48_4_ = 0.5;
      auVar26._52_4_ = 0.5;
      auVar26._56_4_ = 0.5;
      auVar26._60_4_ = 0.5;
      auVar69 = vfmadd213ps_avx512f(local_1e40,auVar69,auVar26);
      local_1fc0 = auVar69._0_8_;
      local_15c0 = local_1fc0;
      uStack_1fb8 = auVar69._8_8_;
      uStack_15b8 = uStack_1fb8;
      uStack_1fb0 = auVar69._16_8_;
      uStack_15b0 = uStack_1fb0;
      uStack_1fa8 = auVar69._24_8_;
      uStack_15a8 = uStack_1fa8;
      uStack_1fa0 = auVar69._32_8_;
      uStack_15a0 = uStack_1fa0;
      uStack_1f98 = auVar69._40_8_;
      uStack_1598 = uStack_1f98;
      uStack_1f90 = auVar69._48_8_;
      uStack_1590 = uStack_1f90;
      uStack_1f88 = auVar69._56_8_;
      uStack_1588 = uStack_1f88;
      local_1600 = local_1e80._0_8_;
      uStack_15f8 = local_1e80._8_8_;
      uStack_15f0 = local_1e80._16_8_;
      uStack_15e8 = local_1e80._24_8_;
      uStack_15e0 = local_1e80._32_8_;
      uStack_15d8 = local_1e80._40_8_;
      uStack_15d0 = local_1e80._48_8_;
      uStack_15c8 = local_1e80._56_8_;
      local_1640 = local_1e40._0_8_;
      uStack_1638 = local_1e40._8_8_;
      uStack_1630 = local_1e40._16_8_;
      uStack_1628 = local_1e40._24_8_;
      uStack_1620 = local_1e40._32_8_;
      uStack_1618 = local_1e40._40_8_;
      uStack_1610 = local_1e40._48_8_;
      uStack_1608 = local_1e40._56_8_;
      auVar71 = vfmadd213ps_avx512f(local_1e80,auVar69,local_1e40);
      local_1fc0 = auVar71._0_8_;
      local_1d80 = local_1fc0;
      uStack_1fb8 = auVar71._8_8_;
      uStack_1d78 = uStack_1fb8;
      uStack_1fb0 = auVar71._16_8_;
      uStack_1d70 = uStack_1fb0;
      uStack_1fa8 = auVar71._24_8_;
      uStack_1d68 = uStack_1fa8;
      uStack_1fa0 = auVar71._32_8_;
      uStack_1d60 = uStack_1fa0;
      uStack_1f98 = auVar71._40_8_;
      uStack_1d58 = uStack_1f98;
      uStack_1f90 = auVar71._48_8_;
      uStack_1d50 = uStack_1f90;
      uStack_1f88 = auVar71._56_8_;
      uStack_1d48 = uStack_1f88;
      local_1dc0[0] = 1.0;
      local_1dc0[1] = 1.0;
      afStack_1db8[0] = 1.0;
      afStack_1db8[1] = 1.0;
      afStack_1db0[0] = 1.0;
      afStack_1db0[1] = 1.0;
      afStack_1da8[0] = 1.0;
      afStack_1da8[1] = 1.0;
      afStack_1da0[0] = 1.0;
      afStack_1da0[1] = 1.0;
      afStack_1d98[0] = 1.0;
      afStack_1d98[1] = 1.0;
      afStack_1d90[0] = 1.0;
      afStack_1d90[1] = 1.0;
      afStack_1d88[0] = 1.0;
      afStack_1d88[1] = 1.0;
      auVar69._8_4_ = 1.0;
      auVar69._12_4_ = 1.0;
      auVar69._0_4_ = 1.0;
      auVar69._4_4_ = 1.0;
      auVar69._16_4_ = 1.0;
      auVar69._20_4_ = 1.0;
      auVar69._24_4_ = 1.0;
      auVar69._28_4_ = 1.0;
      auVar69._32_4_ = 1.0;
      auVar69._36_4_ = 1.0;
      auVar69._40_4_ = 1.0;
      auVar69._44_4_ = 1.0;
      auVar69._48_4_ = 1.0;
      auVar69._52_4_ = 1.0;
      auVar69._56_4_ = 1.0;
      auVar69._60_4_ = 1.0;
      local_dc0 = vaddps_avx512f(auVar71,auVar69);
      local_d00 = local_1ec0._0_8_;
      uStack_cf8 = local_1ec0._8_8_;
      uStack_cf0 = uStack_1eb0;
      uStack_ce8 = uStack_1ea8;
      uStack_ce0 = uStack_1ea0;
      uStack_cd8 = uStack_1e98;
      uStack_cd0 = uStack_1e90;
      uStack_cc8 = uStack_1e88;
      auVar39._16_8_ = uStack_1eb0;
      auVar39._0_16_ = local_1ec0;
      auVar39._24_8_ = uStack_1ea8;
      auVar39._32_8_ = uStack_1ea0;
      auVar39._40_8_ = uStack_1e98;
      auVar39._48_8_ = uStack_1e90;
      auVar39._56_8_ = uStack_1e88;
      local_b80 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(local_b80);
      auVar69 = vcvttps2dq_avx512f(auVar39);
      auVar69 = vmovdqa64_avx512f(auVar69);
      auVar69 = vmovdqa64_avx512f(auVar69);
      auVar71 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_c80 = vmovdqa64_avx512f(auVar69);
      local_cc0 = vmovdqa64_avx512f(auVar71);
      auVar69 = vmovdqa64_avx512f(local_c80);
      auVar71 = vmovdqa64_avx512f(local_cc0);
      auVar69 = vpaddd_avx512f(auVar69,auVar71);
      auVar69 = vmovdqa64_avx512f(auVar69);
      auVar69 = vmovdqa64_avx512f(auVar69);
      local_c00 = vmovdqa64_avx512f(auVar69);
      local_c04 = 0x17;
      auVar69 = vmovdqa64_avx512f(local_c00);
      auVar69 = vpslld_avx512f(auVar69,ZEXT416(0x17));
      local_1f00 = vmovdqa64_avx512f(auVar69);
      auVar69 = vmovdqa64_avx512f(local_1f00);
      local_bc0 = vmovdqa64_avx512f(auVar69);
      local_2000 = vmovdqa64_avx512f(local_bc0);
      local_e00 = local_2000._0_8_;
      uStack_df8 = local_2000._8_8_;
      uStack_df0 = local_2000._16_8_;
      uStack_de8 = local_2000._24_8_;
      uStack_de0 = local_2000._32_8_;
      uStack_dd8 = local_2000._40_8_;
      uStack_dd0 = local_2000._48_8_;
      uStack_dc8 = local_2000._56_8_;
      _local_1fc0 = vmulps_avx512f(local_dc0,local_2000);
      local_2080 = local_1fc0;
      uStack_2078 = uStack_1fb8;
      uStack_2070 = uStack_1fb0;
      uStack_2068 = uStack_1fa8;
      uStack_2060 = uStack_1fa0;
      uStack_2058 = uStack_1f98;
      uStack_2050 = uStack_1f90;
      uStack_2048 = uStack_1f88;
      local_2100 = vaddps_avx512f(local_2200,_local_1fc0);
      auVar69 = vdivps_avx512f(local_2200,local_2100);
      local_1c70 = local_2278;
      local_23c0 = auVar69._0_8_;
      local_1cc0 = local_23c0;
      uStack_23b8 = auVar69._8_8_;
      uStack_1cb8 = uStack_23b8;
      uStack_23b0 = auVar69._16_8_;
      uStack_1cb0 = uStack_23b0;
      uStack_23a8 = auVar69._24_8_;
      uStack_1ca8 = uStack_23a8;
      uStack_23a0 = auVar69._32_8_;
      uStack_1ca0 = uStack_23a0;
      uStack_2398 = auVar69._40_8_;
      uStack_1c98 = uStack_2398;
      uStack_2390 = auVar69._48_8_;
      uStack_1c90 = uStack_2390;
      uStack_2388 = auVar69._56_8_;
      uStack_1c88 = uStack_2388;
      *(undefined8 *)*local_2278 = local_23c0;
      *(undefined8 *)(*local_2278 + 8) = uStack_23b8;
      *(undefined8 *)(*local_2278 + 0x10) = uStack_23b0;
      *(undefined8 *)(*local_2278 + 0x18) = uStack_23a8;
      *(undefined8 *)(*local_2278 + 0x20) = uStack_23a0;
      *(undefined8 *)(*local_2278 + 0x28) = uStack_2398;
      *(undefined8 *)(*local_2278 + 0x30) = uStack_2390;
      *(undefined8 *)(*local_2278 + 0x38) = uStack_2388;
      local_2278 = local_2278 + 1;
      local_2040 = local_20c0;
      uStack_2038 = uStack_20b8;
      uStack_2030 = uStack_20b0;
      uStack_2028 = uStack_20a8;
      uStack_2020 = uStack_20a0;
      uStack_2018 = uStack_2098;
      uStack_2010 = uStack_2090;
      uStack_2008 = uStack_2088;
      _local_1ec0 = auVar70;
      local_1042 = local_1f42;
      local_1040 = local_10c0;
      uStack_1038 = uStack_10b8;
      uStack_1030 = uStack_10b0;
      uStack_1028 = uStack_10a8;
      uStack_1020 = uStack_10a0;
      uStack_1018 = uStack_1098;
      uStack_1010 = uStack_1090;
      uStack_1008 = uStack_1088;
      local_d40 = local_d80;
      uStack_d38 = uStack_d78;
      uStack_d30 = uStack_d70;
      uStack_d28 = uStack_d68;
      uStack_d20 = uStack_d60;
      uStack_d18 = uStack_d58;
      uStack_d10 = uStack_d50;
      uStack_d08 = uStack_d48;
    }
    local_1c64 = 0x3f800000;
    local_ae4 = 0x3f800000;
    local_ae8 = 0x3f800000;
    local_aec = 0x3f800000;
    local_af0 = 0x3f800000;
    local_af4 = 0x3f800000;
    local_af8 = 0x3f800000;
    local_afc = 0x3f800000;
    local_b00 = 0x3f800000;
    auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
    local_b20 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
    auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
    auStack_b10 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
    local_1c60 = 0;
    uStack_1c58 = 0;
    uStack_1c50 = 0;
    uStack_1c48 = 0;
    for (; local_22d0 + 7 < local_2268; local_22d0 = local_22d0 + 8) {
      local_1c28 = local_2278;
      auVar66 = *(undefined1 (*) [24])*local_2278;
      uStack_19e8 = *(undefined8 *)(*local_2278 + 0x18);
      local_1c00 = local_b20._0_8_;
      uStack_1bf8 = local_b20._8_8_;
      uStack_1bf0 = auStack_b10._0_8_;
      uStack_1be8 = auStack_b10._8_8_;
      local_19e0 = 0;
      uStack_19d8 = 0;
      uStack_19d0 = 0;
      uStack_19c8 = 0;
      local_2420 = auVar66._0_8_;
      local_1a00 = local_2420;
      uStack_2418 = auVar66._8_8_;
      uStack_19f8 = uStack_2418;
      uStack_2410 = auVar66._16_8_;
      uStack_19f0 = uStack_2410;
      auVar21 = vsubps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_2278);
      local_1aa0 = 0;
      uStack_1a98 = 0;
      uStack_1a90 = 0;
      uStack_1a88 = 0;
      local_1b40 = 0x3f800000;
      uStack_1b3c = 0x3f800000;
      uStack_1b38 = 0x3f800000;
      uStack_1b34 = 0x3f800000;
      uStack_1b30 = 0x3f800000;
      uStack_1b2c = 0x3f800000;
      uStack_1b28 = 0x3f800000;
      uStack_1b24 = 0x3f800000;
      local_1ac0._0_8_ = auVar21._0_8_;
      local_ac0 = local_1ac0._0_8_;
      local_1ac0._8_8_ = auVar21._8_8_;
      uStack_ab8 = local_1ac0._8_8_;
      local_1ac0._16_8_ = auVar21._16_8_;
      uStack_ab0 = local_1ac0._16_8_;
      local_1ac0._24_8_ = auVar21._24_8_;
      uStack_aa8 = local_1ac0._24_8_;
      local_ae0 = 0x42b0c0a5;
      uStack_adc = 0x42b0c0a5;
      uStack_ad8 = 0x42b0c0a5;
      uStack_ad4 = 0x42b0c0a5;
      uStack_ad0 = 0x42b0c0a5;
      uStack_acc = 0x42b0c0a5;
      uStack_ac8 = 0x42b0c0a5;
      uStack_ac4 = 0x42b0c0a5;
      auVar20._8_4_ = 0x42b0c0a5;
      auVar20._0_8_ = 0x42b0c0a542b0c0a5;
      auVar20._12_4_ = 0x42b0c0a5;
      auVar20._16_4_ = 0x42b0c0a5;
      auVar20._20_4_ = 0x42b0c0a5;
      auVar20._24_4_ = 0x42b0c0a5;
      auVar20._28_4_ = 0x42b0c0a5;
      auVar21 = vminps_avx(auVar21,auVar20);
      local_1ac0._0_8_ = auVar21._0_8_;
      local_a80 = local_1ac0._0_8_;
      local_1ac0._8_8_ = auVar21._8_8_;
      uStack_a78 = local_1ac0._8_8_;
      local_1ac0._16_8_ = auVar21._16_8_;
      uStack_a70 = local_1ac0._16_8_;
      local_1ac0._24_8_ = auVar21._24_8_;
      uStack_a68 = local_1ac0._24_8_;
      local_aa0 = 0xc2b0c0a5;
      uStack_a9c = 0xc2b0c0a5;
      uStack_a98 = 0xc2b0c0a5;
      uStack_a94 = 0xc2b0c0a5;
      uStack_a90 = 0xc2b0c0a5;
      uStack_a8c = 0xc2b0c0a5;
      uStack_a88 = 0xc2b0c0a5;
      uStack_a84 = 0xc2b0c0a5;
      auVar40._8_4_ = 0xc2b0c0a5;
      auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar40._12_4_ = 0xc2b0c0a5;
      auVar40._16_4_ = 0xc2b0c0a5;
      auVar40._20_4_ = 0xc2b0c0a5;
      auVar40._24_4_ = 0xc2b0c0a5;
      auVar40._28_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx(auVar21,auVar40);
      local_a48 = local_1ac0;
      local_9b0 = ::_ps256_cephes_LOG2EF;
      local_9b8 = ::_ps256_0p5;
      local_1ac0._0_8_ = auVar19._0_8_;
      local_7a0 = local_1ac0._0_8_;
      local_1ac0._8_8_ = auVar19._8_8_;
      uStack_798 = local_1ac0._8_8_;
      local_1ac0._16_8_ = auVar19._16_8_;
      uStack_790 = local_1ac0._16_8_;
      local_1ac0._24_8_ = auVar19._24_8_;
      uStack_788 = local_1ac0._24_8_;
      local_7c0[0] = 1.442695;
      local_7c0[1] = 1.442695;
      afStack_7b8[0] = 1.442695;
      afStack_7b8[1] = 1.442695;
      afStack_7b0[0] = 1.442695;
      afStack_7b0[1] = 1.442695;
      afStack_7a8[0] = 1.442695;
      afStack_7a8[1] = 1.442695;
      local_7e0[0] = 0.5;
      local_7e0[1] = 0.5;
      afStack_7d8[0] = 0.5;
      afStack_7d8[1] = 0.5;
      afStack_7d0[0] = 0.5;
      afStack_7d0[1] = 0.5;
      afStack_7c8[0] = 0.5;
      afStack_7c8[1] = 0.5;
      auVar42._8_4_ = 1.442695;
      auVar42._12_4_ = 1.442695;
      auVar42._0_4_ = 1.442695;
      auVar42._4_4_ = 1.442695;
      auVar42._16_4_ = 1.442695;
      auVar42._20_4_ = 1.442695;
      auVar42._24_4_ = 1.442695;
      auVar42._28_4_ = 1.442695;
      auVar41._8_4_ = 0.5;
      auVar41._12_4_ = 0.5;
      auVar41._0_4_ = 0.5;
      auVar41._4_4_ = 0.5;
      auVar41._16_4_ = 0.5;
      auVar41._20_4_ = 0.5;
      auVar41._24_4_ = 0.5;
      auVar41._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar42,auVar19,auVar41);
      auVar20 = vroundps_avx(ZEXT1632(auVar17),1);
      auVar21 = vcmpps_avx(ZEXT1632(auVar17),auVar20,1);
      local_1b60._0_8_ = auVar21._0_8_;
      local_980 = local_1b60._0_8_;
      local_1b60._8_8_ = auVar21._8_8_;
      uStack_978 = local_1b60._8_8_;
      local_1b60._16_8_ = auVar21._16_8_;
      uStack_970 = local_1b60._16_8_;
      local_1b60._24_8_ = auVar21._24_8_;
      uStack_968 = local_1b60._24_8_;
      local_9a0 = 0x3f8000003f800000;
      uStack_998 = 0x3f8000003f800000;
      uStack_990 = 0x3f8000003f800000;
      uStack_988 = 0x3f8000003f800000;
      auVar72._8_8_ = 0x3f8000003f800000;
      auVar72._0_8_ = 0x3f8000003f800000;
      auVar72._16_8_ = 0x3f8000003f800000;
      auVar72._24_8_ = 0x3f8000003f800000;
      local_1b60 = vpand_avx2(auVar21,auVar72);
      local_1ae0 = auVar20._0_8_;
      local_1a20 = local_1ae0;
      uStack_1ad8 = auVar20._8_8_;
      uStack_1a18 = uStack_1ad8;
      uStack_1ad0 = auVar20._16_8_;
      uStack_1a10 = uStack_1ad0;
      uStack_1ac8 = auVar20._24_8_;
      uStack_1a08 = uStack_1ac8;
      local_1a40 = local_1b60._0_8_;
      uStack_1a38 = local_1b60._8_8_;
      uStack_1a30 = local_1b60._16_8_;
      uStack_1a28 = local_1b60._24_8_;
      local_1b00 = vsubps_avx(auVar20,local_1b60);
      local_940 = local_1b00;
      local_930 = ::_ps256_cephes_exp_C1;
      local_500 = local_1b00._0_8_;
      uStack_4f8 = local_1b00._8_8_;
      uStack_4f0 = local_1b00._16_8_;
      uStack_4e8 = local_1b00._24_8_;
      local_520[0] = 0.6933594;
      local_520[1] = 0.6933594;
      afStack_518[0] = 0.6933594;
      afStack_518[1] = 0.6933594;
      afStack_510[0] = 0.6933594;
      afStack_510[1] = 0.6933594;
      afStack_508[0] = 0.6933594;
      afStack_508[1] = 0.6933594;
      local_540 = local_1ac0._0_8_;
      uStack_538 = local_1ac0._8_8_;
      uStack_530 = local_1ac0._16_8_;
      uStack_528 = local_1ac0._24_8_;
      auVar48._8_4_ = 0.6933594;
      auVar48._12_4_ = 0.6933594;
      auVar48._0_4_ = 0.6933594;
      auVar48._4_4_ = 0.6933594;
      auVar48._16_4_ = 0.6933594;
      auVar48._20_4_ = 0.6933594;
      auVar48._24_4_ = 0.6933594;
      auVar48._28_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar48,local_1b00,auVar19);
      local_948 = ::_ps256_cephes_exp_C2;
      local_4a0 = local_1b00._0_8_;
      uStack_498 = local_1b00._8_8_;
      uStack_490 = local_1b00._16_8_;
      uStack_488 = local_1b00._24_8_;
      local_4c0[0] = -0.00021219444;
      local_4c0[1] = -0.00021219444;
      afStack_4b8[0] = -0.00021219444;
      afStack_4b8[1] = -0.00021219444;
      afStack_4b0[0] = -0.00021219444;
      afStack_4b0[1] = -0.00021219444;
      afStack_4a8[0] = -0.00021219444;
      afStack_4a8[1] = -0.00021219444;
      local_1ac0._0_8_ = auVar17._0_8_;
      local_4e0 = local_1ac0._0_8_;
      local_1ac0._8_8_ = auVar17._8_8_;
      uStack_4d8 = local_1ac0._8_8_;
      uStack_4d0 = 0;
      uStack_4c8 = 0;
      auVar49._8_4_ = -0.00021219444;
      auVar49._12_4_ = -0.00021219444;
      auVar49._0_4_ = -0.00021219444;
      auVar49._4_4_ = -0.00021219444;
      auVar49._16_4_ = -0.00021219444;
      auVar49._20_4_ = -0.00021219444;
      auVar49._24_4_ = -0.00021219444;
      auVar49._28_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar49,local_1b00,ZEXT1632(auVar17));
      auVar72 = ZEXT1632(auVar17);
      local_1ac0._0_8_ = auVar17._0_8_;
      local_8e0 = local_1ac0._0_8_;
      local_1ac0._8_8_ = auVar17._8_8_;
      uStack_8d8 = local_1ac0._8_8_;
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_8c0._0_4_ = auVar17._0_4_;
      local_8c0._4_4_ = auVar17._4_4_;
      uStack_8b8._0_4_ = auVar17._8_4_;
      uStack_8b8._4_4_ = auVar17._12_4_;
      local_1ae0._4_4_ = local_8c0._4_4_ * local_8c0._4_4_;
      local_1ae0._0_4_ = (float)local_8c0 * (float)local_8c0;
      local_580 = local_1ae0;
      uStack_1ad8._0_4_ = (float)uStack_8b8 * (float)uStack_8b8;
      uStack_1ad8._4_4_ = uStack_8b8._4_4_ * uStack_8b8._4_4_;
      auVar16 = _local_1ae0;
      _local_1ae0 = ZEXT1632(_local_1ae0);
      auVar40 = _local_1ae0;
      uStack_1b78._0_4_ = 0x39506967;
      local_1b80 = (undefined1  [8])0x3950696739506967;
      uStack_1b78._4_4_ = 0x39506967;
      uStack_1b70._0_4_ = 0x39506967;
      uStack_1b70._4_4_ = 0x39506967;
      auVar66 = _local_1b80;
      uStack_1b68._0_4_ = 0x39506967;
      uStack_1b68._4_4_ = 0x39506967;
      auVar21 = _local_1b80;
      local_a38 = local_1b80;
      local_9d0 = ::_ps256_cephes_exp_p1;
      local_740 = 0x3950696739506967;
      uStack_738 = uStack_1b78;
      uStack_1b70 = auVar66._16_8_;
      uStack_730 = uStack_1b70;
      uStack_1b68 = auVar21._24_8_;
      uStack_728 = uStack_1b68;
      local_760 = local_1ac0._0_8_;
      uStack_758 = local_1ac0._8_8_;
      uStack_750 = 0;
      uStack_748 = 0;
      local_780[0] = 0.0013981999;
      local_780[1] = 0.0013981999;
      afStack_778[0] = 0.0013981999;
      afStack_778[1] = 0.0013981999;
      afStack_770[0] = 0.0013981999;
      afStack_770[1] = 0.0013981999;
      afStack_768[0] = 0.0013981999;
      afStack_768[1] = 0.0013981999;
      auVar43._8_4_ = 0.0013981999;
      auVar43._12_4_ = 0.0013981999;
      auVar43._0_4_ = 0.0013981999;
      auVar43._4_4_ = 0.0013981999;
      auVar43._16_4_ = 0.0013981999;
      auVar43._20_4_ = 0.0013981999;
      auVar43._24_4_ = 0.0013981999;
      auVar43._28_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(auVar72,auVar21,auVar43);
      local_9e8 = ::_ps256_cephes_exp_p2;
      local_1b80 = auVar17._0_8_;
      local_6e0 = local_1b80;
      uStack_1b78 = auVar17._8_8_;
      uStack_6d8 = uStack_1b78;
      uStack_6d0 = 0;
      uStack_6c8 = 0;
      local_700 = local_1ac0._0_8_;
      uStack_6f8 = local_1ac0._8_8_;
      uStack_6f0 = 0;
      uStack_6e8 = 0;
      local_720[0] = 0.008333452;
      local_720[1] = 0.008333452;
      afStack_718[0] = 0.008333452;
      afStack_718[1] = 0.008333452;
      afStack_710[0] = 0.008333452;
      afStack_710[1] = 0.008333452;
      afStack_708[0] = 0.008333452;
      afStack_708[1] = 0.008333452;
      auVar44._8_4_ = 0.008333452;
      auVar44._12_4_ = 0.008333452;
      auVar44._0_4_ = 0.008333452;
      auVar44._4_4_ = 0.008333452;
      auVar44._16_4_ = 0.008333452;
      auVar44._20_4_ = 0.008333452;
      auVar44._24_4_ = 0.008333452;
      auVar44._28_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar17),auVar44);
      local_a00 = ::_ps256_cephes_exp_p3;
      local_1b80 = auVar17._0_8_;
      local_680 = local_1b80;
      uStack_1b78 = auVar17._8_8_;
      uStack_678 = uStack_1b78;
      uStack_670 = 0;
      uStack_668 = 0;
      local_6a0 = local_1ac0._0_8_;
      uStack_698 = local_1ac0._8_8_;
      uStack_690 = 0;
      uStack_688 = 0;
      local_6c0[0] = 0.041665796;
      local_6c0[1] = 0.041665796;
      afStack_6b8[0] = 0.041665796;
      afStack_6b8[1] = 0.041665796;
      afStack_6b0[0] = 0.041665796;
      afStack_6b0[1] = 0.041665796;
      afStack_6a8[0] = 0.041665796;
      afStack_6a8[1] = 0.041665796;
      auVar45._8_4_ = 0.041665796;
      auVar45._12_4_ = 0.041665796;
      auVar45._0_4_ = 0.041665796;
      auVar45._4_4_ = 0.041665796;
      auVar45._16_4_ = 0.041665796;
      auVar45._20_4_ = 0.041665796;
      auVar45._24_4_ = 0.041665796;
      auVar45._28_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar17),auVar45);
      local_a18 = ::_ps256_cephes_exp_p4;
      local_1b80 = auVar17._0_8_;
      local_620 = local_1b80;
      uStack_1b78 = auVar17._8_8_;
      uStack_618 = uStack_1b78;
      uStack_610 = 0;
      uStack_608 = 0;
      local_640 = local_1ac0._0_8_;
      uStack_638 = local_1ac0._8_8_;
      uStack_630 = 0;
      uStack_628 = 0;
      local_660[0] = 0.16666666;
      local_660[1] = 0.16666666;
      afStack_658[0] = 0.16666666;
      afStack_658[1] = 0.16666666;
      afStack_650[0] = 0.16666666;
      afStack_650[1] = 0.16666666;
      afStack_648[0] = 0.16666666;
      afStack_648[1] = 0.16666666;
      auVar46._8_4_ = 0.16666666;
      auVar46._12_4_ = 0.16666666;
      auVar46._0_4_ = 0.16666666;
      auVar46._4_4_ = 0.16666666;
      auVar46._16_4_ = 0.16666666;
      auVar46._20_4_ = 0.16666666;
      auVar46._24_4_ = 0.16666666;
      auVar46._28_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar17),auVar46);
      local_a30 = ::_ps256_cephes_exp_p5;
      local_1b80 = auVar17._0_8_;
      local_5c0 = local_1b80;
      uStack_1b78 = auVar17._8_8_;
      uStack_5b8 = uStack_1b78;
      uStack_5b0 = 0;
      uStack_5a8 = 0;
      local_5e0 = local_1ac0._0_8_;
      uStack_5d8 = local_1ac0._8_8_;
      uStack_5d0 = 0;
      uStack_5c8 = 0;
      local_600[0] = 0.5;
      local_600[1] = 0.5;
      afStack_5f8[0] = 0.5;
      afStack_5f8[1] = 0.5;
      afStack_5f0[0] = 0.5;
      afStack_5f0[1] = 0.5;
      afStack_5e8[0] = 0.5;
      afStack_5e8[1] = 0.5;
      auVar47._8_4_ = 0.5;
      auVar47._12_4_ = 0.5;
      auVar47._0_4_ = 0.5;
      auVar47._4_4_ = 0.5;
      auVar47._16_4_ = 0.5;
      auVar47._20_4_ = 0.5;
      auVar47._24_4_ = 0.5;
      auVar47._28_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar17),auVar47);
      local_a40 = local_1ae0;
      local_1b80 = auVar17._0_8_;
      local_560 = local_1b80;
      uStack_1b78 = auVar17._8_8_;
      uStack_558 = uStack_1b78;
      uStack_550 = 0;
      uStack_548 = 0;
      uStack_1ad8 = auVar16._8_8_;
      uStack_578 = uStack_1ad8;
      uStack_570 = 0;
      uStack_568 = 0;
      local_5a0 = local_1ac0._0_8_;
      uStack_598 = local_1ac0._8_8_;
      uStack_590 = 0;
      uStack_588 = 0;
      auVar17 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar17),auVar72);
      local_1b80 = auVar17._0_8_;
      uVar22 = local_1b80;
      uStack_1b78 = auVar17._8_8_;
      uVar23 = uStack_1b78;
      uStack_1a50 = 0;
      uStack_1a48 = 0;
      local_1a80 = 0x3f8000003f800000;
      uStack_1a78 = 0x3f8000003f800000;
      uStack_1a70 = 0x3f8000003f800000;
      uStack_1a68 = 0x3f8000003f800000;
      local_1a60._0_4_ = auVar17._0_4_;
      local_1a60._4_4_ = auVar17._4_4_;
      uStack_1a58._0_4_ = auVar17._8_4_;
      uStack_1a58._4_4_ = auVar17._12_4_;
      local_1b80._4_4_ = local_1a60._4_4_ + 1.0;
      local_1b80._0_4_ = (float)local_1a60 + 1.0;
      uStack_1b78._0_4_ = (float)uStack_1a58 + 1.0;
      uStack_1b78._4_4_ = uStack_1a58._4_4_ + 1.0;
      uStack_1b70._0_4_ = 0x3f800000;
      uStack_1b70._4_4_ = 0x3f800000;
      uStack_1b68._0_4_ = 0x3f800000;
      uStack_1b68._4_4_ = 0x3f800000;
      local_8a0._0_4_ = local_1b00._0_4_;
      local_8a0._4_4_ = local_1b00._4_4_;
      uStack_898._0_4_ = local_1b00._8_4_;
      uStack_898._4_4_ = local_1b00._12_4_;
      uStack_890._0_4_ = local_1b00._16_4_;
      uStack_890._4_4_ = local_1b00._20_4_;
      uStack_888._0_4_ = local_1b00._24_4_;
      uStack_888._4_4_ = local_1b00._28_4_;
      local_1b20._4_4_ = (int)local_8a0._4_4_;
      local_1b20._0_4_ = (int)(float)local_8a0;
      local_1b20._8_4_ = (int)(float)uStack_898;
      local_1b20._12_4_ = (int)uStack_898._4_4_;
      local_1b20._16_4_ = (int)(float)uStack_890;
      local_1b20._20_4_ = (int)uStack_890._4_4_;
      auVar66 = local_1b20._0_24_;
      local_1b20._24_4_ = (int)(float)uStack_888;
      local_1b20._28_4_ = (int)uStack_888._4_4_;
      auVar21 = local_1b20;
      local_860 = local_1b20._0_8_;
      uStack_858 = local_1b20._8_8_;
      local_1b20._16_8_ = auVar66._16_8_;
      uStack_850 = local_1b20._16_8_;
      local_1b20._24_8_ = auVar21._24_8_;
      uStack_848 = local_1b20._24_8_;
      local_880 = 0x7f0000007f;
      uStack_878 = 0x7f0000007f;
      uStack_870 = 0x7f0000007f;
      uStack_868 = 0x7f0000007f;
      local_460 = local_1b20._0_8_;
      uStack_458 = local_1b20._8_8_;
      uStack_450 = local_1b20._16_8_;
      uStack_448 = local_1b20._24_8_;
      local_480 = 0x7f0000007f;
      uStack_478 = 0x7f0000007f;
      uStack_470 = 0x7f0000007f;
      uStack_468 = 0x7f0000007f;
      auVar51._16_8_ = local_1b20._16_8_;
      auVar51._0_16_ = local_1b20._0_16_;
      auVar51._24_8_ = local_1b20._24_8_;
      auVar50._8_8_ = 0x7f0000007f;
      auVar50._0_8_ = 0x7f0000007f;
      auVar50._16_8_ = 0x7f0000007f;
      auVar50._24_8_ = 0x7f0000007f;
      auVar21 = vpaddd_avx2(auVar51,auVar50);
      local_1b20._0_8_ = auVar21._0_8_;
      local_820 = local_1b20._0_8_;
      local_1b20._8_8_ = auVar21._8_8_;
      uStack_818 = local_1b20._8_8_;
      local_1b20._16_8_ = auVar21._16_8_;
      uStack_810 = local_1b20._16_8_;
      local_1b20._24_8_ = auVar21._24_8_;
      uStack_808 = local_1b20._24_8_;
      local_824 = 0x17;
      local_420 = local_1b20._0_8_;
      uStack_418 = local_1b20._8_8_;
      uStack_410 = local_1b20._16_8_;
      uStack_408 = local_1b20._24_8_;
      local_424 = 0x17;
      local_1b20 = vpslld_avx2(auVar21,ZEXT416(0x17));
      local_800 = local_1b20._0_8_;
      uStack_7f8 = local_1b20._8_8_;
      uStack_7f0 = local_1b20._16_8_;
      uStack_7e8 = local_1b20._24_8_;
      local_1ba0 = local_1b20._0_8_;
      uStack_1b98 = local_1b20._8_8_;
      uStack_1b90 = local_1b20._16_8_;
      uStack_1b88 = local_1b20._24_8_;
      local_900 = _local_1b80;
      local_920._0_4_ = local_1b20._0_4_;
      local_920._4_4_ = local_1b20._4_4_;
      uStack_918._0_4_ = local_1b20._8_4_;
      uStack_918._4_4_ = local_1b20._12_4_;
      uStack_910._0_4_ = local_1b20._16_4_;
      uStack_910._4_4_ = local_1b20._20_4_;
      uStack_908._0_4_ = local_1b20._24_4_;
      local_1b80._0_4_ = ((float)local_1a60 + 1.0) * (float)local_920;
      local_1b80._4_4_ = (local_1a60._4_4_ + 1.0) * local_920._4_4_;
      uStack_918._0_4_ = ((float)uStack_1a58 + 1.0) * (float)uStack_918;
      uStack_918._4_4_ = (uStack_1a58._4_4_ + 1.0) * uStack_918._4_4_;
      uStack_1b78._0_4_ = (float)uStack_918;
      uStack_1b78._4_4_ = uStack_918._4_4_;
      uStack_1b70._0_4_ = (float)uStack_910 * 1.0;
      uStack_1b70._4_4_ = uStack_910._4_4_ * 1.0;
      auVar66 = _local_1b80;
      uStack_1b68._0_4_ = (float)uStack_908 * 1.0;
      uStack_1b68._4_4_ = 0x3f800000;
      auVar20 = _local_1b80;
      local_1be0 = local_1b80;
      uStack_1bd8 = uStack_1b78;
      uStack_1b70 = auVar66._16_8_;
      uStack_1bd0 = uStack_1b70;
      uStack_1b68 = auVar20._24_8_;
      uStack_1bc8 = uStack_1b68;
      local_1bc0._0_4_ = local_b20._0_4_;
      local_1bc0._4_4_ = local_b20._4_4_;
      uStack_1bb8._0_4_ = local_b20._8_4_;
      uStack_1bb8._4_4_ = local_b20._12_4_;
      uStack_1bb0._0_4_ = auStack_b10._0_4_;
      uStack_1bb0._4_4_ = auStack_b10._4_4_;
      uStack_1ba8._0_4_ = auStack_b10._8_4_;
      uStack_1ba8._4_4_ = auStack_b10._12_4_;
      local_1c20 = (float)local_1bc0 + (float)local_1b80._0_4_;
      fStack_1c1c = local_1bc0._4_4_ + (float)local_1b80._4_4_;
      fStack_1c18 = (float)uStack_1bb8 + (float)uStack_918;
      fStack_1c14 = uStack_1bb8._4_4_ + uStack_918._4_4_;
      fStack_1c10 = (float)uStack_1bb0 + (float)uStack_910 * 1.0;
      fStack_1c0c = uStack_1bb0._4_4_ + uStack_910._4_4_ * 1.0;
      fStack_1c08 = (float)uStack_1ba8 + (float)uStack_908 * 1.0;
      fStack_1c04 = uStack_1ba8._4_4_ + 1.0;
      auVar19._16_8_ = auStack_b10._0_8_;
      auVar19._0_16_ = local_b20;
      auVar19._24_8_ = auStack_b10._8_8_;
      auVar21._4_4_ = fStack_1c1c;
      auVar21._0_4_ = local_1c20;
      auVar21._8_4_ = fStack_1c18;
      auVar21._12_4_ = fStack_1c14;
      auVar21._16_4_ = fStack_1c10;
      auVar21._20_4_ = fStack_1c0c;
      auVar21._24_4_ = fStack_1c08;
      auVar21._28_4_ = fStack_1c04;
      auVar21 = vdivps_avx(auVar19,auVar21);
      local_1988 = local_2278;
      local_2420 = auVar21._0_8_;
      local_19c0 = local_2420;
      uStack_2418 = auVar21._8_8_;
      uStack_19b8 = uStack_2418;
      uStack_2410 = auVar21._16_8_;
      uStack_19b0 = uStack_2410;
      uStack_2408 = auVar21._24_8_;
      uStack_19a8 = uStack_2408;
      *(undefined8 *)*local_2278 = local_2420;
      *(undefined8 *)(*local_2278 + 8) = uStack_2418;
      *(undefined8 *)(*local_2278 + 0x10) = uStack_2410;
      *(undefined8 *)(*local_2278 + 0x18) = uStack_2408;
      local_2278 = (undefined1 (*) [64])(*local_2278 + 0x20);
      local_1bc0 = local_1c00;
      uStack_1bb8 = uStack_1bf8;
      uStack_1bb0 = uStack_1bf0;
      uStack_1ba8 = uStack_1be8;
      _local_1b80 = auVar20;
      _local_1ae0 = auVar40;
      local_1ac0 = auVar72;
      local_1a60 = uVar22;
      uStack_1a58 = uVar23;
      local_a28 = local_a48;
      local_a20 = local_a38;
      local_a10 = local_a48;
      local_a08 = local_a38;
      local_9f8 = local_a48;
      local_9f0 = local_a38;
      local_9e0 = local_a48;
      local_9d8 = local_a38;
      local_9c8 = local_a48;
      local_9c0 = local_a38;
      local_9a8 = local_a48;
      local_950 = local_a48;
      local_938 = local_a48;
      local_928 = local_940;
      local_920 = local_1b20._0_8_;
      uStack_918 = local_1b20._8_8_;
      uStack_910 = local_1b20._16_8_;
      uStack_908 = local_1b20._24_8_;
      local_8c0 = local_8e0;
      uStack_8b8 = uStack_8d8;
      uStack_8b0 = uStack_8d0;
      uStack_8a8 = uStack_8c8;
      local_8a0 = local_1b00._0_8_;
      uStack_898 = local_1b00._8_8_;
      uStack_890 = local_1b00._16_8_;
      uStack_888 = local_1b00._24_8_;
    }
    local_1964 = 0x3f800000;
    local_1980 = 0x3f800000;
    uStack_197c = 0x3f800000;
    uStack_1978 = 0x3f800000;
    uStack_1974 = 0x3f800000;
    local_1960 = (undefined1  [16])0x0;
    for (; local_1770 = local_2210, local_22a0 = local_17d0, local_22d0 + 3 < local_2268;
        local_22d0 = local_22d0 + 4) {
      local_1948 = local_2278;
      local_1810 = *(undefined8 *)*local_2278;
      uStack_1808 = *(undefined8 *)(*local_2278 + 8);
      local_1800 = 0;
      uStack_17f8 = 0;
      auVar17 = vsubps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_2278);
      local_1880 = (undefined1  [16])0x0;
      local_18d0 = 0x3f800000;
      uStack_18cc = 0x3f800000;
      uStack_18c8 = 0x3f800000;
      uStack_18c4 = 0x3f800000;
      local_1890._0_8_ = auVar17._0_8_;
      local_3e0 = local_1890._0_8_;
      local_1890._8_8_ = auVar17._8_8_;
      uStack_3d8 = local_1890._8_8_;
      local_3f0 = 0x42b0c0a5;
      uStack_3ec = 0x42b0c0a5;
      uStack_3e8 = 0x42b0c0a5;
      uStack_3e4 = 0x42b0c0a5;
      auVar18._8_4_ = 0x42b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar18._12_4_ = 0x42b0c0a5;
      auVar17 = vminps_avx(auVar17,auVar18);
      local_1890._0_8_ = auVar17._0_8_;
      local_3c0 = local_1890._0_8_;
      local_1890._8_8_ = auVar17._8_8_;
      uStack_3b8 = local_1890._8_8_;
      local_3d0 = 0xc2b0c0a5;
      uStack_3cc = 0xc2b0c0a5;
      uStack_3c8 = 0xc2b0c0a5;
      uStack_3c4 = 0xc2b0c0a5;
      auVar52._8_4_ = 0xc2b0c0a5;
      auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar52._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar17,auVar52);
      local_1890._0_8_ = auVar18._0_8_;
      uVar22 = local_1890._0_8_;
      local_1890._8_8_ = auVar18._8_8_;
      uVar23 = local_1890._8_8_;
      local_370 = 0x3fb8aa3b;
      uStack_36c = 0x3fb8aa3b;
      uStack_368 = 0x3fb8aa3b;
      uStack_364 = 0x3fb8aa3b;
      local_360._0_4_ = auVar18._0_4_;
      local_360._4_4_ = auVar18._4_4_;
      uStack_358._0_4_ = auVar18._8_4_;
      uStack_358._4_4_ = auVar18._12_4_;
      local_18b0._4_4_ = local_360._4_4_ * 1.442695;
      local_18b0._0_4_ = (float)local_360 * 1.442695;
      uStack_18a8._0_4_ = (float)uStack_358 * 1.442695;
      uStack_18a8._4_4_ = uStack_358._4_4_ * 1.442695;
      local_1840 = local_18b0;
      uStack_1838 = uStack_18a8;
      local_1850 = 0x3f000000;
      uStack_184c = 0x3f000000;
      uStack_1848 = 0x3f000000;
      uStack_1844 = 0x3f000000;
      local_18b0._0_4_ = (float)local_360 * 1.442695 + 0.5;
      local_18b0._4_4_ = local_360._4_4_ * 1.442695 + 0.5;
      fVar73 = (float)uStack_358 * 1.442695 + 0.5;
      fVar74 = uStack_358._4_4_ * 1.442695 + 0.5;
      uStack_18a8._0_4_ = fVar73;
      uStack_18a8._4_4_ = fVar74;
      local_340 = local_18b0;
      uStack_338 = uStack_18a8;
      local_18c0._4_4_ = (int)(float)local_18b0._4_4_;
      local_18c0._0_4_ = (int)(float)local_18b0._0_4_;
      local_18c0._8_4_ = (int)fVar73;
      local_18c0._12_4_ = (int)fVar74;
      local_330 = local_18c0._0_8_;
      uStack_328 = local_18c0._8_8_;
      auVar53._8_8_ = local_18c0._8_8_;
      auVar53._0_8_ = local_18c0._0_8_;
      auVar16 = vcvtdq2ps_avx(auVar53);
      local_18a0 = auVar16._0_8_;
      local_310 = local_18a0;
      uStack_1898 = auVar16._8_8_;
      uStack_308 = uStack_1898;
      local_320 = local_18b0;
      uStack_318 = uStack_18a8;
      auVar54._8_8_ = uStack_18a8;
      auVar54._0_8_ = local_18b0;
      auVar17 = vcmpps_avx(auVar54,auVar16,1);
      local_18e0._0_8_ = auVar17._0_8_;
      local_2f0 = local_18e0._0_8_;
      local_18e0._8_8_ = auVar17._8_8_;
      uStack_2e8 = local_18e0._8_8_;
      local_300 = 0x3f8000003f800000;
      uStack_2f8 = 0x3f8000003f800000;
      auVar55._8_8_ = 0x3f8000003f800000;
      auVar55._0_8_ = 0x3f8000003f800000;
      local_18e0 = vpand_avx(auVar17,auVar55);
      local_1820 = local_18a0;
      uStack_1818 = uStack_1898;
      local_1830 = local_18e0._0_8_;
      uStack_1828 = local_18e0._8_8_;
      _local_18b0 = vsubps_avx(auVar16,local_18e0);
      local_2d0 = local_18b0;
      local_2c0 = ::_ps_cephes_exp_C1;
      local_2e0 = local_1890;
      local_1b0 = local_18b0;
      uStack_1a8 = uStack_18a8;
      local_1c0[0] = 0.6933594;
      local_1c0[1] = 0.6933594;
      afStack_1b8[0] = 0.6933594;
      afStack_1b8[1] = 0.6933594;
      local_1d0 = local_1890._0_8_;
      uStack_1c8 = local_1890._8_8_;
      auVar58._8_4_ = 0.6933594;
      auVar58._12_4_ = 0.6933594;
      auVar58._0_4_ = 0.6933594;
      auVar58._4_4_ = 0.6933594;
      auVar17 = vfnmadd213ps_fma(auVar58,_local_18b0,auVar18);
      local_2d8 = ::_ps_cephes_exp_C2;
      local_180 = local_18b0;
      uStack_178 = uStack_18a8;
      local_190[0] = -0.00021219444;
      local_190[1] = -0.00021219444;
      afStack_188[0] = -0.00021219444;
      afStack_188[1] = -0.00021219444;
      local_1890._0_8_ = auVar17._0_8_;
      local_1a0 = local_1890._0_8_;
      local_1890._8_8_ = auVar17._8_8_;
      uStack_198 = local_1890._8_8_;
      auVar59._8_4_ = -0.00021219444;
      auVar59._12_4_ = -0.00021219444;
      auVar59._0_4_ = -0.00021219444;
      auVar59._4_4_ = -0.00021219444;
      local_1890 = vfnmadd213ps_fma(auVar59,_local_18b0,auVar17);
      local_390 = local_1890._0_8_;
      uStack_388 = local_1890._8_8_;
      local_380._0_4_ = local_1890._0_4_;
      local_380._4_4_ = local_1890._4_4_;
      uStack_378._0_4_ = local_1890._8_4_;
      uStack_378._4_4_ = local_1890._12_4_;
      local_18a0._4_4_ = local_380._4_4_ * local_380._4_4_;
      local_18a0._0_4_ = (float)local_380 * (float)local_380;
      uStack_1898._0_4_ = (float)uStack_378 * (float)uStack_378;
      uStack_1898._4_4_ = uStack_378._4_4_ * uStack_378._4_4_;
      uStack_18e8._0_4_ = 0x39506967;
      local_18f0 = (undefined1  [8])0x3950696739506967;
      uStack_18e8._4_4_ = 0x39506967;
      local_2a0 = local_18f0;
      local_238 = ::_ps_cephes_exp_p1;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_18e8;
      local_160 = local_1890._0_8_;
      uStack_158 = local_1890._8_8_;
      local_170[0] = 0.0013981999;
      local_170[1] = 0.0013981999;
      afStack_168[0] = 0.0013981999;
      afStack_168[1] = 0.0013981999;
      auVar60._8_4_ = 0.0013981999;
      auVar60._12_4_ = 0.0013981999;
      auVar60._0_4_ = 0.0013981999;
      auVar60._4_4_ = 0.0013981999;
      auVar17 = vfmadd213ps_fma(local_1890,_local_18f0,auVar60);
      local_250 = ::_ps_cephes_exp_p2;
      local_18f0 = auVar17._0_8_;
      local_120 = local_18f0;
      uStack_18e8 = auVar17._8_8_;
      uStack_118 = uStack_18e8;
      local_130 = local_1890._0_8_;
      uStack_128 = local_1890._8_8_;
      local_140[0] = 0.008333452;
      local_140[1] = 0.008333452;
      afStack_138[0] = 0.008333452;
      afStack_138[1] = 0.008333452;
      auVar61._8_4_ = 0.008333452;
      auVar61._12_4_ = 0.008333452;
      auVar61._0_4_ = 0.008333452;
      auVar61._4_4_ = 0.008333452;
      auVar17 = vfmadd213ps_fma(local_1890,auVar17,auVar61);
      local_268 = ::_ps_cephes_exp_p3;
      local_18f0 = auVar17._0_8_;
      local_f0 = local_18f0;
      uStack_18e8 = auVar17._8_8_;
      uStack_e8 = uStack_18e8;
      local_100 = local_1890._0_8_;
      uStack_f8 = local_1890._8_8_;
      local_110[0] = 0.041665796;
      local_110[1] = 0.041665796;
      afStack_108[0] = 0.041665796;
      afStack_108[1] = 0.041665796;
      auVar62._8_4_ = 0.041665796;
      auVar62._12_4_ = 0.041665796;
      auVar62._0_4_ = 0.041665796;
      auVar62._4_4_ = 0.041665796;
      auVar17 = vfmadd213ps_fma(local_1890,auVar17,auVar62);
      local_280 = ::_ps_cephes_exp_p4;
      local_18f0 = auVar17._0_8_;
      local_c0 = local_18f0;
      uStack_18e8 = auVar17._8_8_;
      uStack_b8 = uStack_18e8;
      local_d0 = local_1890._0_8_;
      uStack_c8 = local_1890._8_8_;
      local_e0[0] = 0.16666666;
      local_e0[1] = 0.16666666;
      afStack_d8[0] = 0.16666666;
      afStack_d8[1] = 0.16666666;
      auVar63._8_4_ = 0.16666666;
      auVar63._12_4_ = 0.16666666;
      auVar63._0_4_ = 0.16666666;
      auVar63._4_4_ = 0.16666666;
      auVar17 = vfmadd213ps_fma(local_1890,auVar17,auVar63);
      local_298 = ::_ps_cephes_exp_p5;
      local_18f0 = auVar17._0_8_;
      local_90 = local_18f0;
      uStack_18e8 = auVar17._8_8_;
      uStack_88 = uStack_18e8;
      local_a0 = local_1890._0_8_;
      uStack_98 = local_1890._8_8_;
      local_b0[0] = 0.5;
      local_b0[1] = 0.5;
      afStack_a8[0] = 0.5;
      afStack_a8[1] = 0.5;
      auVar64._8_4_ = 0.5;
      auVar64._12_4_ = 0.5;
      auVar64._0_4_ = 0.5;
      auVar64._4_4_ = 0.5;
      auVar17 = vfmadd213ps_fma(local_1890,auVar17,auVar64);
      local_2a8 = local_18a0;
      local_18f0 = auVar17._0_8_;
      local_60 = local_18f0;
      uStack_18e8 = auVar17._8_8_;
      uStack_58 = uStack_18e8;
      local_70 = local_18a0;
      uStack_68 = uStack_1898;
      local_80 = local_1890._0_8_;
      uStack_78 = local_1890._8_8_;
      auVar17 = vfmadd213ps_fma(_local_18a0,auVar17,local_1890);
      local_18f0 = auVar17._0_8_;
      uVar24 = local_18f0;
      uStack_18e8 = auVar17._8_8_;
      uVar25 = uStack_18e8;
      local_1870 = 0x3f8000003f800000;
      uStack_1868 = 0x3f8000003f800000;
      local_1860._0_4_ = auVar17._0_4_;
      local_1860._4_4_ = auVar17._4_4_;
      uStack_1858._0_4_ = auVar17._8_4_;
      uStack_1858._4_4_ = auVar17._12_4_;
      local_18f0._4_4_ = local_1860._4_4_ + 1.0;
      local_18f0._0_4_ = (float)local_1860 + 1.0;
      uStack_18e8._0_4_ = (float)uStack_1858 + 1.0;
      uStack_18e8._4_4_ = uStack_1858._4_4_ + 1.0;
      local_350._0_4_ = local_18b0._0_4_;
      local_350._4_4_ = local_18b0._4_4_;
      uStack_348._0_4_ = local_18b0._8_4_;
      uStack_348._4_4_ = local_18b0._12_4_;
      local_18c0._4_4_ = (int)local_350._4_4_;
      local_18c0._0_4_ = (int)(float)local_350;
      local_18c0._8_4_ = (int)(float)uStack_348;
      local_18c0._12_4_ = (int)uStack_348._4_4_;
      local_210 = local_18c0._0_8_;
      uStack_208 = local_18c0._8_8_;
      local_220 = 0x7f0000007f;
      uStack_218 = 0x7f0000007f;
      auVar57._8_8_ = local_18c0._8_8_;
      auVar57._0_8_ = local_18c0._0_8_;
      auVar56._8_8_ = 0x7f0000007f;
      auVar56._0_8_ = 0x7f0000007f;
      auVar17 = vpaddd_avx(auVar57,auVar56);
      local_18c0._0_8_ = auVar17._0_8_;
      local_1f0 = local_18c0._0_8_;
      local_18c0._8_8_ = auVar17._8_8_;
      uStack_1e8 = local_18c0._8_8_;
      local_1f4 = 0x17;
      local_18c0 = vpslld_avx(auVar17,ZEXT416(0x17));
      local_1e0 = local_18c0._0_8_;
      uStack_1d8 = local_18c0._8_8_;
      local_1900 = local_18c0._0_8_;
      uStack_18f8 = local_18c0._8_8_;
      local_3a0 = _local_18f0;
      local_3b0._0_4_ = local_18c0._0_4_;
      local_3b0._4_4_ = local_18c0._4_4_;
      uStack_3a8._0_4_ = local_18c0._8_4_;
      uStack_3a8._4_4_ = local_18c0._12_4_;
      local_18f0._0_4_ = ((float)local_1860 + 1.0) * (float)local_3b0;
      local_18f0._4_4_ = (local_1860._4_4_ + 1.0) * local_3b0._4_4_;
      uStack_3a8._0_4_ = ((float)uStack_1858 + 1.0) * (float)uStack_3a8;
      uStack_3a8._4_4_ = (uStack_1858._4_4_ + 1.0) * uStack_3a8._4_4_;
      uStack_18e8._0_4_ = (float)uStack_3a8;
      uStack_18e8._4_4_ = uStack_3a8._4_4_;
      local_1920 = local_18f0;
      uStack_1918 = uStack_18e8;
      local_1940 = (float)local_18f0._0_4_ + 1.0;
      fStack_193c = (float)local_18f0._4_4_ + 1.0;
      fStack_1938 = (float)uStack_3a8 + 1.0;
      fStack_1934 = uStack_3a8._4_4_ + 1.0;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar17._4_4_ = fStack_193c;
      auVar17._0_4_ = local_1940;
      auVar17._8_4_ = fStack_1938;
      auVar17._12_4_ = fStack_1934;
      auVar17 = vdivps_avx(auVar16,auVar17);
      local_17d8 = local_2278;
      local_2450 = auVar17._0_8_;
      local_17f0 = local_2450;
      uStack_2448 = auVar17._8_8_;
      uStack_17e8 = uStack_2448;
      *(undefined8 *)*local_2278 = local_2450;
      *(undefined8 *)(*local_2278 + 8) = uStack_2448;
      local_2278 = (undefined1 (*) [64])(*local_2278 + 0x10);
      local_1930 = 0x3f8000003f800000;
      uStack_1928 = 0x3f8000003f800000;
      local_1910 = 0x3f8000003f800000;
      uStack_1908 = 0x3f8000003f800000;
      local_1860 = uVar24;
      uStack_1858 = uVar25;
      local_3b0 = local_18c0._0_8_;
      uStack_3a8 = local_18c0._8_8_;
      local_380 = local_390;
      uStack_378 = uStack_388;
      local_360 = uVar22;
      uStack_358 = uVar23;
      local_350 = local_18b0;
      uStack_348 = uStack_18a8;
      local_2c8 = local_2e0;
      local_2b8 = local_2d0;
      local_2b0 = local_2e0;
      local_290 = local_2e0;
      local_288 = local_2a0;
      local_278 = local_2e0;
      local_270 = local_2a0;
      local_260 = local_2e0;
      local_258 = local_2a0;
      local_248 = local_2e0;
      local_240 = local_2a0;
      local_230 = local_2e0;
      local_228 = local_2a0;
    }
    for (; local_22d0 < local_2268; local_22d0 = local_22d0 + 1) {
      fVar73 = expf(-*(float *)*local_2278);
      *(float *)*local_2278 = 1.0 / (fVar73 + 1.0);
      local_2278 = (undefined1 (*) [64])(*local_2278 + 4);
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}